

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O0

void intgemm::AVX512BW::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndWrite>
               (int8_t *A,int8_t *B,Index A_rows,Index width,Index B_cols,
               UnquantizeAndWrite callback)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  char cVar10;
  __m512i second;
  __m512i second_00;
  __m512i second_01;
  __m512i second_02;
  __m512i second_03;
  __m512i second_04;
  __m512i second_05;
  __m512i second_06;
  __m512i second_07;
  __m512i second_08;
  __m512i second_09;
  __m512i second_10;
  __m512i second_11;
  __m512i second_12;
  __m512i second_13;
  __m512i second_14;
  __m512i first;
  __m512i first_00;
  __m512i first_01;
  __m512i first_02;
  __m512i first_03;
  __m512i first_04;
  __m512i first_05;
  __m512i first_06;
  __m512i first_07;
  __m512i first_08;
  __m512i first_09;
  __m512i first_10;
  __m512i first_11;
  __m512i first_12;
  __m512i first_13;
  __m512i first_14;
  vector_t<CPUType::AVX2,_int> input;
  __m512i pack4567_00;
  __m512i pack0123_00;
  __m512i sum3_00;
  __m512i sum3_01;
  __m512i sum2_00;
  __m512i sum2_01;
  __m512i sum1_00;
  __m512i sum1_01;
  __m512i sum0_00;
  __m512i sum0_01;
  undefined1 (*pauVar11) [64];
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar12 [24];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 in_ZMM0 [64];
  __m256i total;
  Register pack4567;
  Register pack0123;
  Register ones;
  __m512i b7;
  __m512i b6;
  __m512i b5;
  __m512i b4;
  __m512i b3;
  __m512i b2;
  __m512i b1;
  __m512i b0;
  Register sum7;
  Register sum6;
  Register sum5;
  Register sum4;
  Register sum3;
  Register sum2;
  Register sum1;
  Register sum0;
  __m512i a_positive;
  __mmask64 neg_mask;
  __m512i a;
  Register *B_live;
  Register *A_end;
  Register *A_live;
  Index A_rowidx;
  Register *B0_col;
  Index B0_colidx;
  Register zeros;
  Index simd_width;
  CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndWrite> callback_impl;
  undefined1 in_stack_ffffffffffff8b80 [64];
  undefined1 in_stack_ffffffffffff8c00 [56];
  longlong in_stack_ffffffffffff8c38;
  undefined1 in_stack_ffffffffffff8c40 [56];
  OutputBufferInfo *in_stack_ffffffffffff8c90;
  undefined8 in_stack_ffffffffffff8c98;
  CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndWrite> *this;
  undefined8 uVar31;
  longlong lVar32;
  OutputBufferInfo local_7310;
  undefined1 local_7300 [56];
  undefined1 auVar33 [56];
  undefined1 in_stack_ffffffffffff8d80 [32];
  CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndWrite>
  *in_stack_ffffffffffff8da0;
  undefined8 in_stack_ffffffffffff8da8;
  longlong in_stack_ffffffffffff8db0;
  longlong in_stack_ffffffffffff8df8;
  undefined1 in_stack_ffffffffffff8e00 [56];
  longlong in_stack_ffffffffffff8e38;
  undefined1 in_stack_ffffffffffff8e40 [56];
  longlong in_stack_ffffffffffff8e78;
  undefined1 in_stack_ffffffffffff8e80 [56];
  longlong in_stack_ffffffffffff8eb8;
  undefined1 in_stack_ffffffffffff8ec0 [56];
  undefined1 local_6b80 [64];
  undefined1 local_6b40 [64];
  undefined1 local_6b00 [64];
  undefined1 local_6ac0 [64];
  undefined1 local_6a80 [64];
  undefined1 local_6a40 [64];
  undefined1 local_6a00 [64];
  undefined1 local_69c0 [64];
  undefined1 local_6980 [64];
  undefined1 local_6940 [64];
  undefined1 local_6900 [64];
  undefined1 local_68c0 [64];
  undefined1 local_6880 [64];
  undefined1 local_6840 [64];
  undefined1 local_6800 [64];
  undefined1 local_67c0 [64];
  undefined1 local_6780 [64];
  undefined1 local_6740 [64];
  undefined1 local_6700 [64];
  undefined1 local_66c0 [64];
  undefined1 local_6680 [64];
  undefined1 local_6640 [64];
  undefined1 local_6600 [64];
  undefined1 local_65c0 [64];
  undefined1 local_6580 [64];
  undefined1 local_6540 [64];
  undefined1 local_6500 [64];
  undefined1 local_64c0 [64];
  undefined1 local_6480 [64];
  undefined1 local_6440 [64];
  undefined1 local_6400 [64];
  undefined1 local_63c0 [64];
  undefined1 local_6380 [64];
  undefined1 local_6340 [64];
  undefined1 local_6300 [64];
  undefined1 local_62c0 [64];
  undefined1 local_6280 [64];
  undefined1 local_6240 [64];
  undefined1 local_6200 [64];
  undefined1 local_61c0 [64];
  undefined1 local_6180 [64];
  undefined1 local_6140 [64];
  undefined1 local_6100 [64];
  undefined1 local_60c0 [64];
  undefined1 local_6080 [64];
  undefined1 local_6040 [64];
  undefined1 local_6000 [64];
  undefined1 local_5fc0 [64];
  undefined1 local_5f80 [64];
  undefined1 local_5f40 [64];
  undefined1 local_5f00 [64];
  undefined1 local_5ec0 [64];
  undefined1 local_5e80 [64];
  undefined1 local_5e40 [64];
  undefined1 local_5e00 [64];
  undefined1 local_5dc0 [64];
  undefined1 local_5d80 [64];
  undefined1 local_5d40 [64];
  undefined1 local_5d00 [64];
  undefined1 local_5cc0 [64];
  undefined1 local_5c80 [64];
  undefined1 local_5c40 [64];
  undefined1 local_5c00 [64];
  undefined1 local_5bc0 [64];
  undefined1 local_5b80 [64];
  undefined1 local_5b40 [64];
  undefined1 local_5b00 [64];
  undefined1 local_5ac0 [64];
  undefined1 local_5a80 [64];
  undefined1 local_5a40 [64];
  undefined1 local_5a00 [64];
  undefined1 local_59c0 [64];
  undefined1 local_5980 [64];
  undefined1 local_5940 [64];
  undefined1 local_5900 [64];
  undefined1 local_58c0 [64];
  undefined1 local_5880 [64];
  undefined1 local_5840 [64];
  undefined1 local_5800 [64];
  undefined1 local_57c0 [64];
  undefined1 local_5780 [64];
  undefined1 local_5740 [64];
  undefined1 local_5700 [64];
  undefined1 local_56c0 [64];
  undefined1 local_5680 [64];
  undefined1 local_5640 [64];
  undefined1 local_5600 [64];
  undefined1 local_55c0 [64];
  undefined1 local_5580 [64];
  undefined1 local_5540 [64];
  undefined1 local_5500 [64];
  undefined1 local_54c0 [64];
  undefined1 local_5480 [64];
  undefined1 local_5440 [64];
  undefined1 local_5400 [64];
  undefined1 local_53c0 [64];
  undefined1 local_5380 [64];
  undefined1 local_5340 [64];
  undefined1 local_5300 [64];
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  ulong local_4d88;
  undefined1 local_4d80 [64];
  undefined1 (*local_4d30) [64];
  undefined1 (*local_4d28) [64];
  undefined1 (*local_4d20) [64];
  uint local_4d14;
  undefined1 (*local_4d10) [64];
  uint local_4d04;
  undefined1 local_4d00 [64];
  uint local_4c84;
  uint local_4c2c;
  uint local_4c28;
  uint local_4c24;
  long local_4c20;
  long local_4c18;
  undefined4 local_4c10;
  undefined1 local_4c00 [64];
  undefined1 local_4b81;
  undefined1 local_4b80 [64];
  undefined1 local_4b01;
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  ulong local_4508;
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  ulong local_42c8;
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  ulong local_4088;
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  ulong local_3e48;
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  ulong local_3c08;
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  ulong local_39c8;
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  ulong local_3788;
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  ulong local_3548;
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  ulong local_3308;
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  undefined1 local_31c0 [64];
  undefined1 local_3180 [64];
  undefined1 local_3140 [64];
  ulong local_30c8;
  undefined1 local_30c0 [64];
  undefined1 local_3080 [64];
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  undefined1 local_2fc0 [64];
  undefined1 local_2f80 [64];
  undefined1 local_2f40 [64];
  undefined1 local_2f00 [64];
  ulong local_2e88;
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  ulong local_2c48;
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  ulong local_2a08;
  undefined1 local_2a00 [64];
  undefined1 local_29c0 [64];
  undefined1 local_2980 [64];
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined1 local_28c0 [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  ulong local_27c8;
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  ulong local_2588;
  undefined1 local_2580 [64];
  undefined1 local_2540 [64];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  ulong local_2348;
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [64];
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [64];
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_4c10 = in_ZMM0._0_4_;
  local_4c2c = in_R8D;
  local_4c28 = in_ECX;
  local_4c24 = in_EDX;
  local_4c20 = in_RSI;
  local_4c18 = in_RDI;
  callbacks::CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndWrite>::CallbackImpl
            (in_stack_ffffffffffff8b80._8_8_,in_stack_ffffffffffff8b80._0_8_);
  local_4c84 = local_4c28 >> 6;
  setzero_si<long_long__vector(8)>();
  local_4d00 = vmovdqa64_avx512f(in_ZMM0);
  for (local_4d04 = 0; local_4d04 < local_4c2c; local_4d04 = local_4d04 + 8) {
    local_4d10 = (undefined1 (*) [64])(local_4c20 + (ulong)(local_4d04 * local_4c84) * 0x40);
    for (local_4d14 = 0; local_4d14 < local_4c24; local_4d14 = local_4d14 + 1) {
      local_4d20 = (undefined1 (*) [64])(local_4c18 + (ulong)(local_4d14 * local_4c28));
      local_4d28 = local_4d20 + local_4c84;
      local_4d30 = local_4d10;
      auVar13 = vmovdqa64_avx512f(*local_4d20);
      local_4d80 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_4d80);
      local_4b01 = 0x80;
      auVar14 = vpbroadcastb_avx512bw(ZEXT116(0x80));
      local_4b80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_4b80);
      local_4e00 = vmovdqa64_avx512f(auVar13);
      local_4e40 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e40);
      local_4940 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_4e00);
      local_4980 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_4980);
      auVar14 = vmovdqa64_avx512f(local_4940);
      local_4840 = vmovdqa64_avx512f(auVar13);
      local_4880 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4840);
      auVar14 = vmovdqa64_avx512f(local_4880);
      local_48c0 = vmovdqa64_avx512f(auVar13);
      local_4900 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4900);
      local_1240 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_48c0);
      local_1280 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_1280);
      auVar14 = vmovdqa64_avx512f(local_1240);
      local_11c0 = vmovdqa64_avx512f(auVar13);
      local_1200 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_11c0);
      auVar14 = vmovdqa64_avx512f(local_1200);
      auVar13 = vpandq_avx512f(auVar13,auVar14);
      local_1300 = vmovdqa64_avx512f(ZEXT1664(ZEXT816(0) << 0x40));
      auVar14 = vmovdqa64_avx512f(local_1300);
      local_4d88 = vpcmpb_avx512bw(auVar13,auVar14,4);
      auVar13 = vmovdqa64_avx512f(local_4d80);
      local_4ec0 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_4ec0);
      local_4780 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_4780);
      local_4740 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpabsb_avx512bw(local_4740);
      local_4e80 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(*local_4d10);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_4f40 = vmovdqa64_avx512f(auVar14);
      local_4f80 = vmovdqa64_avx512f(auVar15);
      local_4fc0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_4fc0);
      local_24c0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_4f80);
      local_2500 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_4f40);
      local_2540 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2540);
      auVar15 = vmovdqa64_avx512f(local_2500);
      auVar16 = vmovdqa64_avx512f(local_24c0);
      local_2340 = vmovdqa64_avx512f(auVar14);
      local_23c0 = vmovdqa64_avx512f(auVar15);
      local_2400 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_23c0);
      auVar15 = vmovdqa64_avx512f(local_2400);
      local_2440 = vmovdqa64_avx512f(auVar14);
      local_2480 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_2480);
      local_1040 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2440);
      local_1080 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_1080);
      auVar15 = vmovdqa64_avx512f(local_1040);
      local_fc0 = vmovdqa64_avx512f(auVar14);
      local_1000 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_fc0);
      auVar15 = vmovdqa64_avx512f(local_1000);
      auVar16 = vmovdqa64_avx512f(local_2340);
      auVar14 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar15[0] = bVar1 * auVar14[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar15[1] = bVar1 * auVar14[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar15[2] = bVar1 * auVar14[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar15[3] = bVar1 * auVar14[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar15[4] = bVar1 * auVar14[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar15[5] = bVar1 * auVar14[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar15[6] = bVar1 * auVar14[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar15[7] = bVar1 * auVar14[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar15[8] = bVar1 * auVar14[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar15[9] = bVar1 * auVar14[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar15[10] = bVar1 * auVar14[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar15[0xb] = bVar1 * auVar14[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar15[0xc] = bVar1 * auVar14[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar15[0xd] = bVar1 * auVar14[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar15[0xe] = bVar1 * auVar14[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar15[0xf] = bVar1 * auVar14[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar15[0x10] = bVar1 * auVar14[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar15[0x11] = bVar1 * auVar14[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar15[0x12] = bVar1 * auVar14[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar15[0x13] = bVar1 * auVar14[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar15[0x14] = bVar1 * auVar14[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar15[0x15] = bVar1 * auVar14[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar15[0x16] = bVar1 * auVar14[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar15[0x17] = bVar1 * auVar14[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar15[0x18] = bVar1 * auVar14[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar15[0x19] = bVar1 * auVar14[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar15[0x1a] = bVar1 * auVar14[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar15[0x1b] = bVar1 * auVar14[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar15[0x1c] = bVar1 * auVar14[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar15[0x1d] = bVar1 * auVar14[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar15[0x1e] = bVar1 * auVar14[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar15[0x1f] = bVar1 * auVar14[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar15[0x20] = bVar1 * auVar14[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar15[0x21] = bVar1 * auVar14[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar15[0x22] = bVar1 * auVar14[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar15[0x23] = bVar1 * auVar14[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar15[0x24] = bVar1 * auVar14[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar15[0x25] = bVar1 * auVar14[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar15[0x26] = bVar1 * auVar14[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar15[0x27] = bVar1 * auVar14[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar15[0x28] = bVar1 * auVar14[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar15[0x29] = bVar1 * auVar14[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar15[0x2a] = bVar1 * auVar14[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar15[0x2b] = bVar1 * auVar14[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar15[0x2c] = bVar1 * auVar14[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar15[0x2d] = bVar1 * auVar14[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar15[0x2e] = bVar1 * auVar14[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar15[0x2f] = bVar1 * auVar14[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar15[0x30] = bVar1 * auVar14[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar15[0x31] = bVar1 * auVar14[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar15[0x32] = bVar1 * auVar14[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar15[0x33] = bVar1 * auVar14[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar15[0x34] = bVar1 * auVar14[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar15[0x35] = bVar1 * auVar14[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar15[0x36] = bVar1 * auVar14[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar15[0x37] = bVar1 * auVar14[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar15[0x38] = (bVar8 & 1) * auVar14[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar15[0x39] = bVar1 * auVar14[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar15[0x3a] = bVar1 * auVar14[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar15[0x3b] = bVar1 * auVar14[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar15[0x3c] = bVar1 * auVar14[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar15[0x3d] = bVar1 * auVar14[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar15[0x3e] = bVar1 * auVar14[0x3e] | !bVar1 * auVar16[0x3e];
      auVar15[0x3f] =
           -((char)bVar8 >> 7) * auVar14[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5000 = vmovdqa64_avx512f(auVar13);
      local_5040 = vmovdqa64_avx512f(auVar15);
      auVar13 = vmovdqa64_avx512f(local_5040);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5000);
      vmovdqa64_avx512f(auVar14);
      first[1] = in_stack_ffffffffffff8c40._0_8_;
      first[2] = in_stack_ffffffffffff8c40._8_8_;
      first[3] = in_stack_ffffffffffff8c40._16_8_;
      first[4] = in_stack_ffffffffffff8c40._24_8_;
      first[5] = in_stack_ffffffffffff8c40._32_8_;
      first[6] = in_stack_ffffffffffff8c40._40_8_;
      first[7] = in_stack_ffffffffffff8c40._48_8_;
      first[0] = in_stack_ffffffffffff8c38;
      second[1] = in_stack_ffffffffffff8c00._0_8_;
      second[2] = in_stack_ffffffffffff8c00._8_8_;
      second[3] = in_stack_ffffffffffff8c00._16_8_;
      second[4] = in_stack_ffffffffffff8c00._24_8_;
      second[5] = in_stack_ffffffffffff8c00._32_8_;
      second[6] = in_stack_ffffffffffff8c00._40_8_;
      second[7] = in_stack_ffffffffffff8c00._48_8_;
      second[0] = auVar13._56_8_;
      local_2348 = local_4d88;
      maddubs_epi16(first,second);
      local_4f00 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(local_4d30[1]);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_50c0 = vmovdqa64_avx512f(auVar14);
      local_5100 = vmovdqa64_avx512f(auVar15);
      local_5140 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5140);
      local_2700 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5100);
      local_2740 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_50c0);
      local_2780 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2780);
      auVar15 = vmovdqa64_avx512f(local_2740);
      auVar16 = vmovdqa64_avx512f(local_2700);
      local_2580 = vmovdqa64_avx512f(auVar14);
      local_2588 = local_4d88;
      local_2600 = vmovdqa64_avx512f(auVar15);
      local_2640 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_2600);
      auVar15 = vmovdqa64_avx512f(local_2640);
      local_2680 = vmovdqa64_avx512f(auVar14);
      local_26c0 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_26c0);
      local_f40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2680);
      local_f80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_f80);
      auVar15 = vmovdqa64_avx512f(local_f40);
      local_ec0 = vmovdqa64_avx512f(auVar14);
      local_f00 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_ec0);
      auVar15 = vmovdqa64_avx512f(local_f00);
      auVar16 = vmovdqa64_avx512f(local_2580);
      auVar14 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar17[0] = bVar1 * auVar14[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar17[1] = bVar1 * auVar14[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar17[2] = bVar1 * auVar14[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar17[3] = bVar1 * auVar14[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar17[4] = bVar1 * auVar14[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar17[5] = bVar1 * auVar14[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar17[6] = bVar1 * auVar14[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar17[7] = bVar1 * auVar14[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar17[8] = bVar1 * auVar14[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar17[9] = bVar1 * auVar14[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar17[10] = bVar1 * auVar14[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar17[0xb] = bVar1 * auVar14[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar17[0xc] = bVar1 * auVar14[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar17[0xd] = bVar1 * auVar14[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar17[0xe] = bVar1 * auVar14[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar17[0xf] = bVar1 * auVar14[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar17[0x10] = bVar1 * auVar14[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar17[0x11] = bVar1 * auVar14[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar17[0x12] = bVar1 * auVar14[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar17[0x13] = bVar1 * auVar14[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar17[0x14] = bVar1 * auVar14[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar17[0x15] = bVar1 * auVar14[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar17[0x16] = bVar1 * auVar14[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar17[0x17] = bVar1 * auVar14[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar17[0x18] = bVar1 * auVar14[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar17[0x19] = bVar1 * auVar14[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar17[0x1a] = bVar1 * auVar14[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar17[0x1b] = bVar1 * auVar14[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar17[0x1c] = bVar1 * auVar14[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar17[0x1d] = bVar1 * auVar14[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar17[0x1e] = bVar1 * auVar14[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar17[0x1f] = bVar1 * auVar14[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar17[0x20] = bVar1 * auVar14[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar17[0x21] = bVar1 * auVar14[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar17[0x22] = bVar1 * auVar14[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar17[0x23] = bVar1 * auVar14[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar17[0x24] = bVar1 * auVar14[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar17[0x25] = bVar1 * auVar14[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar17[0x26] = bVar1 * auVar14[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar17[0x27] = bVar1 * auVar14[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar17[0x28] = bVar1 * auVar14[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar17[0x29] = bVar1 * auVar14[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar17[0x2a] = bVar1 * auVar14[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar17[0x2b] = bVar1 * auVar14[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar17[0x2c] = bVar1 * auVar14[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar17[0x2d] = bVar1 * auVar14[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar17[0x2e] = bVar1 * auVar14[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar17[0x2f] = bVar1 * auVar14[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar17[0x30] = bVar1 * auVar14[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar17[0x31] = bVar1 * auVar14[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar17[0x32] = bVar1 * auVar14[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar17[0x33] = bVar1 * auVar14[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar17[0x34] = bVar1 * auVar14[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar17[0x35] = bVar1 * auVar14[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar17[0x36] = bVar1 * auVar14[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar17[0x37] = bVar1 * auVar14[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar17[0x38] = (bVar8 & 1) * auVar14[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar17[0x39] = bVar1 * auVar14[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar17[0x3a] = bVar1 * auVar14[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar17[0x3b] = bVar1 * auVar14[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar17[0x3c] = bVar1 * auVar14[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar17[0x3d] = bVar1 * auVar14[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar17[0x3e] = bVar1 * auVar14[0x3e] | !bVar1 * auVar16[0x3e];
      auVar17[0x3f] =
           -((char)bVar8 >> 7) * auVar14[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5180 = vmovdqa64_avx512f(auVar13);
      local_51c0 = vmovdqa64_avx512f(auVar17);
      auVar13 = vmovdqa64_avx512f(local_51c0);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5180);
      vmovdqa64_avx512f(auVar14);
      first_00[1] = in_stack_ffffffffffff8c40._0_8_;
      first_00[2] = in_stack_ffffffffffff8c40._8_8_;
      first_00[3] = in_stack_ffffffffffff8c40._16_8_;
      first_00[4] = in_stack_ffffffffffff8c40._24_8_;
      first_00[5] = in_stack_ffffffffffff8c40._32_8_;
      first_00[6] = in_stack_ffffffffffff8c40._40_8_;
      first_00[7] = in_stack_ffffffffffff8c40._48_8_;
      first_00[0] = in_stack_ffffffffffff8c38;
      second_00[1] = in_stack_ffffffffffff8c00._0_8_;
      second_00[2] = in_stack_ffffffffffff8c00._8_8_;
      second_00[3] = in_stack_ffffffffffff8c00._16_8_;
      second_00[4] = in_stack_ffffffffffff8c00._24_8_;
      second_00[5] = in_stack_ffffffffffff8c00._32_8_;
      second_00[6] = in_stack_ffffffffffff8c00._40_8_;
      second_00[7] = in_stack_ffffffffffff8c00._48_8_;
      second_00[0] = auVar13._56_8_;
      maddubs_epi16(first_00,second_00);
      local_5080 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(local_4d30[2]);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_5240 = vmovdqa64_avx512f(auVar14);
      local_5280 = vmovdqa64_avx512f(auVar15);
      local_52c0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_52c0);
      local_2940 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5280);
      local_2980 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5240);
      local_29c0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_29c0);
      auVar15 = vmovdqa64_avx512f(local_2980);
      auVar16 = vmovdqa64_avx512f(local_2940);
      local_27c0 = vmovdqa64_avx512f(auVar14);
      local_27c8 = local_4d88;
      local_2840 = vmovdqa64_avx512f(auVar15);
      local_2880 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_2840);
      auVar15 = vmovdqa64_avx512f(local_2880);
      local_28c0 = vmovdqa64_avx512f(auVar14);
      local_2900 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_2900);
      local_e40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_28c0);
      local_e80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_e80);
      auVar15 = vmovdqa64_avx512f(local_e40);
      local_dc0 = vmovdqa64_avx512f(auVar14);
      local_e00 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_dc0);
      auVar15 = vmovdqa64_avx512f(local_e00);
      auVar16 = vmovdqa64_avx512f(local_27c0);
      auVar15 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar14[0] = bVar1 * auVar15[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar14[1] = bVar1 * auVar15[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar14[2] = bVar1 * auVar15[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar14[3] = bVar1 * auVar15[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar14[4] = bVar1 * auVar15[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar14[5] = bVar1 * auVar15[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar14[6] = bVar1 * auVar15[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar14[7] = bVar1 * auVar15[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar14[8] = bVar1 * auVar15[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar14[9] = bVar1 * auVar15[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar14[10] = bVar1 * auVar15[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar14[0xb] = bVar1 * auVar15[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar14[0xc] = bVar1 * auVar15[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar14[0xd] = bVar1 * auVar15[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar14[0xe] = bVar1 * auVar15[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar14[0xf] = bVar1 * auVar15[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar14[0x10] = bVar1 * auVar15[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar14[0x11] = bVar1 * auVar15[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar14[0x12] = bVar1 * auVar15[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar14[0x13] = bVar1 * auVar15[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar14[0x14] = bVar1 * auVar15[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar14[0x15] = bVar1 * auVar15[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar14[0x16] = bVar1 * auVar15[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar14[0x17] = bVar1 * auVar15[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar14[0x18] = bVar1 * auVar15[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar14[0x19] = bVar1 * auVar15[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar14[0x1a] = bVar1 * auVar15[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar14[0x1b] = bVar1 * auVar15[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar14[0x1c] = bVar1 * auVar15[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar14[0x1d] = bVar1 * auVar15[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar14[0x1e] = bVar1 * auVar15[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar14[0x1f] = bVar1 * auVar15[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar14[0x20] = bVar1 * auVar15[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar14[0x21] = bVar1 * auVar15[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar14[0x22] = bVar1 * auVar15[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar14[0x23] = bVar1 * auVar15[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar14[0x24] = bVar1 * auVar15[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar14[0x25] = bVar1 * auVar15[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar14[0x26] = bVar1 * auVar15[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar14[0x27] = bVar1 * auVar15[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar14[0x28] = bVar1 * auVar15[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar14[0x29] = bVar1 * auVar15[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar14[0x2a] = bVar1 * auVar15[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar14[0x2b] = bVar1 * auVar15[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar14[0x2c] = bVar1 * auVar15[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar14[0x2d] = bVar1 * auVar15[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar14[0x2e] = bVar1 * auVar15[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar14[0x2f] = bVar1 * auVar15[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar14[0x30] = bVar1 * auVar15[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar14[0x31] = bVar1 * auVar15[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar14[0x32] = bVar1 * auVar15[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar14[0x33] = bVar1 * auVar15[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar14[0x34] = bVar1 * auVar15[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar14[0x35] = bVar1 * auVar15[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar14[0x36] = bVar1 * auVar15[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar14[0x37] = bVar1 * auVar15[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar14[0x38] = (bVar8 & 1) * auVar15[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar14[0x39] = bVar1 * auVar15[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar14[0x3a] = bVar1 * auVar15[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar14[0x3b] = bVar1 * auVar15[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar14[0x3c] = bVar1 * auVar15[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar14[0x3d] = bVar1 * auVar15[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar14[0x3e] = bVar1 * auVar15[0x3e] | !bVar1 * auVar16[0x3e];
      auVar14[0x3f] =
           -((char)bVar8 >> 7) * auVar15[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5300 = vmovdqa64_avx512f(auVar13);
      local_5340 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_5340);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5300);
      vmovdqa64_avx512f(auVar14);
      first_01[1] = in_stack_ffffffffffff8c40._0_8_;
      first_01[2] = in_stack_ffffffffffff8c40._8_8_;
      first_01[3] = in_stack_ffffffffffff8c40._16_8_;
      first_01[4] = in_stack_ffffffffffff8c40._24_8_;
      first_01[5] = in_stack_ffffffffffff8c40._32_8_;
      first_01[6] = in_stack_ffffffffffff8c40._40_8_;
      first_01[7] = in_stack_ffffffffffff8c40._48_8_;
      first_01[0] = in_stack_ffffffffffff8c38;
      second_01[1] = in_stack_ffffffffffff8c00._0_8_;
      second_01[2] = in_stack_ffffffffffff8c00._8_8_;
      second_01[3] = in_stack_ffffffffffff8c00._16_8_;
      second_01[4] = in_stack_ffffffffffff8c00._24_8_;
      second_01[5] = in_stack_ffffffffffff8c00._32_8_;
      second_01[6] = in_stack_ffffffffffff8c00._40_8_;
      second_01[7] = in_stack_ffffffffffff8c00._48_8_;
      second_01[0] = auVar13._56_8_;
      maddubs_epi16(first_01,second_01);
      local_5200 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(local_4d30[3]);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_53c0 = vmovdqa64_avx512f(auVar14);
      local_5400 = vmovdqa64_avx512f(auVar15);
      local_5440 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5440);
      local_2b80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5400);
      local_2bc0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_53c0);
      local_2c00 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2c00);
      auVar15 = vmovdqa64_avx512f(local_2bc0);
      auVar16 = vmovdqa64_avx512f(local_2b80);
      local_2a00 = vmovdqa64_avx512f(auVar14);
      local_2a08 = local_4d88;
      local_2a80 = vmovdqa64_avx512f(auVar15);
      local_2ac0 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_2a80);
      auVar15 = vmovdqa64_avx512f(local_2ac0);
      local_2b00 = vmovdqa64_avx512f(auVar14);
      local_2b40 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_2b40);
      local_d40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2b00);
      local_d80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_d80);
      auVar15 = vmovdqa64_avx512f(local_d40);
      local_cc0 = vmovdqa64_avx512f(auVar14);
      local_d00 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_cc0);
      auVar15 = vmovdqa64_avx512f(local_d00);
      auVar16 = vmovdqa64_avx512f(local_2a00);
      auVar14 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar18[0] = bVar1 * auVar14[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar18[1] = bVar1 * auVar14[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar18[2] = bVar1 * auVar14[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar18[3] = bVar1 * auVar14[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar18[4] = bVar1 * auVar14[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar18[5] = bVar1 * auVar14[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar18[6] = bVar1 * auVar14[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar18[7] = bVar1 * auVar14[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar18[8] = bVar1 * auVar14[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar18[9] = bVar1 * auVar14[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar18[10] = bVar1 * auVar14[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar18[0xb] = bVar1 * auVar14[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar18[0xc] = bVar1 * auVar14[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar18[0xd] = bVar1 * auVar14[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar18[0xe] = bVar1 * auVar14[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar18[0xf] = bVar1 * auVar14[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar18[0x10] = bVar1 * auVar14[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar18[0x11] = bVar1 * auVar14[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar18[0x12] = bVar1 * auVar14[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar18[0x13] = bVar1 * auVar14[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar18[0x14] = bVar1 * auVar14[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar18[0x15] = bVar1 * auVar14[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar18[0x16] = bVar1 * auVar14[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar18[0x17] = bVar1 * auVar14[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar18[0x18] = bVar1 * auVar14[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar18[0x19] = bVar1 * auVar14[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar18[0x1a] = bVar1 * auVar14[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar18[0x1b] = bVar1 * auVar14[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar18[0x1c] = bVar1 * auVar14[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar18[0x1d] = bVar1 * auVar14[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar18[0x1e] = bVar1 * auVar14[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar18[0x1f] = bVar1 * auVar14[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar18[0x20] = bVar1 * auVar14[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar18[0x21] = bVar1 * auVar14[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar18[0x22] = bVar1 * auVar14[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar18[0x23] = bVar1 * auVar14[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar18[0x24] = bVar1 * auVar14[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar18[0x25] = bVar1 * auVar14[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar18[0x26] = bVar1 * auVar14[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar18[0x27] = bVar1 * auVar14[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar18[0x28] = bVar1 * auVar14[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar18[0x29] = bVar1 * auVar14[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar18[0x2a] = bVar1 * auVar14[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar18[0x2b] = bVar1 * auVar14[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar18[0x2c] = bVar1 * auVar14[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar18[0x2d] = bVar1 * auVar14[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar18[0x2e] = bVar1 * auVar14[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar18[0x2f] = bVar1 * auVar14[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar18[0x30] = bVar1 * auVar14[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar18[0x31] = bVar1 * auVar14[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar18[0x32] = bVar1 * auVar14[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar18[0x33] = bVar1 * auVar14[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar18[0x34] = bVar1 * auVar14[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar18[0x35] = bVar1 * auVar14[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar18[0x36] = bVar1 * auVar14[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar18[0x37] = bVar1 * auVar14[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar18[0x38] = (bVar8 & 1) * auVar14[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar18[0x39] = bVar1 * auVar14[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar18[0x3a] = bVar1 * auVar14[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar18[0x3b] = bVar1 * auVar14[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar18[0x3c] = bVar1 * auVar14[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar18[0x3d] = bVar1 * auVar14[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar18[0x3e] = bVar1 * auVar14[0x3e] | !bVar1 * auVar16[0x3e];
      auVar18[0x3f] =
           -((char)bVar8 >> 7) * auVar14[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5480 = vmovdqa64_avx512f(auVar13);
      local_54c0 = vmovdqa64_avx512f(auVar18);
      auVar13 = vmovdqa64_avx512f(local_54c0);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5480);
      vmovdqa64_avx512f(auVar14);
      first_02[1] = in_stack_ffffffffffff8c40._0_8_;
      first_02[2] = in_stack_ffffffffffff8c40._8_8_;
      first_02[3] = in_stack_ffffffffffff8c40._16_8_;
      first_02[4] = in_stack_ffffffffffff8c40._24_8_;
      first_02[5] = in_stack_ffffffffffff8c40._32_8_;
      first_02[6] = in_stack_ffffffffffff8c40._40_8_;
      first_02[7] = in_stack_ffffffffffff8c40._48_8_;
      first_02[0] = in_stack_ffffffffffff8c38;
      second_02[1] = in_stack_ffffffffffff8c00._0_8_;
      second_02[2] = in_stack_ffffffffffff8c00._8_8_;
      second_02[3] = in_stack_ffffffffffff8c00._16_8_;
      second_02[4] = in_stack_ffffffffffff8c00._24_8_;
      second_02[5] = in_stack_ffffffffffff8c00._32_8_;
      second_02[6] = in_stack_ffffffffffff8c00._40_8_;
      second_02[7] = in_stack_ffffffffffff8c00._48_8_;
      second_02[0] = auVar13._56_8_;
      maddubs_epi16(first_02,second_02);
      local_5380 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(local_4d30[4]);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_5540 = vmovdqa64_avx512f(auVar14);
      local_5580 = vmovdqa64_avx512f(auVar15);
      local_55c0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_55c0);
      local_2dc0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5580);
      local_2e00 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5540);
      local_2e40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2e40);
      auVar15 = vmovdqa64_avx512f(local_2e00);
      auVar16 = vmovdqa64_avx512f(local_2dc0);
      local_2c40 = vmovdqa64_avx512f(auVar14);
      local_2c48 = local_4d88;
      local_2cc0 = vmovdqa64_avx512f(auVar15);
      local_2d00 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_2cc0);
      auVar15 = vmovdqa64_avx512f(local_2d00);
      local_2d40 = vmovdqa64_avx512f(auVar14);
      local_2d80 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_2d80);
      local_c40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2d40);
      local_c80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_c80);
      auVar15 = vmovdqa64_avx512f(local_c40);
      local_bc0 = vmovdqa64_avx512f(auVar14);
      local_c00 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_bc0);
      auVar15 = vmovdqa64_avx512f(local_c00);
      auVar16 = vmovdqa64_avx512f(local_2c40);
      auVar14 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar19[0] = bVar1 * auVar14[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar19[1] = bVar1 * auVar14[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar19[2] = bVar1 * auVar14[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar19[3] = bVar1 * auVar14[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar19[4] = bVar1 * auVar14[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar19[5] = bVar1 * auVar14[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar19[6] = bVar1 * auVar14[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar19[7] = bVar1 * auVar14[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar19[8] = bVar1 * auVar14[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar19[9] = bVar1 * auVar14[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar19[10] = bVar1 * auVar14[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar19[0xb] = bVar1 * auVar14[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar19[0xc] = bVar1 * auVar14[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar19[0xd] = bVar1 * auVar14[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar19[0xe] = bVar1 * auVar14[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar19[0xf] = bVar1 * auVar14[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar19[0x10] = bVar1 * auVar14[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar19[0x11] = bVar1 * auVar14[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar19[0x12] = bVar1 * auVar14[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar19[0x13] = bVar1 * auVar14[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar19[0x14] = bVar1 * auVar14[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar19[0x15] = bVar1 * auVar14[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar19[0x16] = bVar1 * auVar14[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar19[0x17] = bVar1 * auVar14[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar19[0x18] = bVar1 * auVar14[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar19[0x19] = bVar1 * auVar14[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar19[0x1a] = bVar1 * auVar14[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar19[0x1b] = bVar1 * auVar14[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar19[0x1c] = bVar1 * auVar14[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar19[0x1d] = bVar1 * auVar14[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar19[0x1e] = bVar1 * auVar14[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar19[0x1f] = bVar1 * auVar14[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar19[0x20] = bVar1 * auVar14[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar19[0x21] = bVar1 * auVar14[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar19[0x22] = bVar1 * auVar14[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar19[0x23] = bVar1 * auVar14[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar19[0x24] = bVar1 * auVar14[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar19[0x25] = bVar1 * auVar14[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar19[0x26] = bVar1 * auVar14[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar19[0x27] = bVar1 * auVar14[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar19[0x28] = bVar1 * auVar14[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar19[0x29] = bVar1 * auVar14[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar19[0x2a] = bVar1 * auVar14[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar19[0x2b] = bVar1 * auVar14[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar19[0x2c] = bVar1 * auVar14[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar19[0x2d] = bVar1 * auVar14[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar19[0x2e] = bVar1 * auVar14[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar19[0x2f] = bVar1 * auVar14[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar19[0x30] = bVar1 * auVar14[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar19[0x31] = bVar1 * auVar14[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar19[0x32] = bVar1 * auVar14[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar19[0x33] = bVar1 * auVar14[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar19[0x34] = bVar1 * auVar14[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar19[0x35] = bVar1 * auVar14[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar19[0x36] = bVar1 * auVar14[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar19[0x37] = bVar1 * auVar14[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar19[0x38] = (bVar8 & 1) * auVar14[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar19[0x39] = bVar1 * auVar14[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar19[0x3a] = bVar1 * auVar14[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar19[0x3b] = bVar1 * auVar14[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar19[0x3c] = bVar1 * auVar14[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar19[0x3d] = bVar1 * auVar14[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar19[0x3e] = bVar1 * auVar14[0x3e] | !bVar1 * auVar16[0x3e];
      auVar19[0x3f] =
           -((char)bVar8 >> 7) * auVar14[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5600 = vmovdqa64_avx512f(auVar13);
      local_5640 = vmovdqa64_avx512f(auVar19);
      auVar13 = vmovdqa64_avx512f(local_5640);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5600);
      vmovdqa64_avx512f(auVar14);
      first_03[1] = in_stack_ffffffffffff8c40._0_8_;
      first_03[2] = in_stack_ffffffffffff8c40._8_8_;
      first_03[3] = in_stack_ffffffffffff8c40._16_8_;
      first_03[4] = in_stack_ffffffffffff8c40._24_8_;
      first_03[5] = in_stack_ffffffffffff8c40._32_8_;
      first_03[6] = in_stack_ffffffffffff8c40._40_8_;
      first_03[7] = in_stack_ffffffffffff8c40._48_8_;
      first_03[0] = in_stack_ffffffffffff8c38;
      second_03[1] = in_stack_ffffffffffff8c00._0_8_;
      second_03[2] = in_stack_ffffffffffff8c00._8_8_;
      second_03[3] = in_stack_ffffffffffff8c00._16_8_;
      second_03[4] = in_stack_ffffffffffff8c00._24_8_;
      second_03[5] = in_stack_ffffffffffff8c00._32_8_;
      second_03[6] = in_stack_ffffffffffff8c00._40_8_;
      second_03[7] = in_stack_ffffffffffff8c00._48_8_;
      second_03[0] = auVar13._56_8_;
      maddubs_epi16(first_03,second_03);
      local_5500 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(local_4d30[5]);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_56c0 = vmovdqa64_avx512f(auVar14);
      local_5700 = vmovdqa64_avx512f(auVar15);
      local_5740 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5740);
      local_3000 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5700);
      local_3040 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_56c0);
      local_3080 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_3080);
      auVar15 = vmovdqa64_avx512f(local_3040);
      auVar16 = vmovdqa64_avx512f(local_3000);
      local_2e80 = vmovdqa64_avx512f(auVar14);
      local_2e88 = local_4d88;
      local_2f00 = vmovdqa64_avx512f(auVar15);
      local_2f40 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_2f00);
      auVar15 = vmovdqa64_avx512f(local_2f40);
      local_2f80 = vmovdqa64_avx512f(auVar14);
      local_2fc0 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_2fc0);
      local_b40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_2f80);
      local_b80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_b80);
      auVar15 = vmovdqa64_avx512f(local_b40);
      local_ac0 = vmovdqa64_avx512f(auVar14);
      local_b00 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_ac0);
      auVar15 = vmovdqa64_avx512f(local_b00);
      auVar16 = vmovdqa64_avx512f(local_2e80);
      auVar14 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar20[0] = bVar1 * auVar14[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar20[1] = bVar1 * auVar14[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar20[2] = bVar1 * auVar14[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar20[3] = bVar1 * auVar14[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar20[4] = bVar1 * auVar14[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar20[5] = bVar1 * auVar14[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar20[6] = bVar1 * auVar14[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar20[7] = bVar1 * auVar14[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar20[8] = bVar1 * auVar14[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar20[9] = bVar1 * auVar14[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar20[10] = bVar1 * auVar14[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar20[0xb] = bVar1 * auVar14[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar20[0xc] = bVar1 * auVar14[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar20[0xd] = bVar1 * auVar14[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar20[0xe] = bVar1 * auVar14[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar20[0xf] = bVar1 * auVar14[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar20[0x10] = bVar1 * auVar14[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar20[0x11] = bVar1 * auVar14[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar20[0x12] = bVar1 * auVar14[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar20[0x13] = bVar1 * auVar14[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar20[0x14] = bVar1 * auVar14[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar20[0x15] = bVar1 * auVar14[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar20[0x16] = bVar1 * auVar14[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar20[0x17] = bVar1 * auVar14[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar20[0x18] = bVar1 * auVar14[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar20[0x19] = bVar1 * auVar14[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar20[0x1a] = bVar1 * auVar14[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar20[0x1b] = bVar1 * auVar14[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar20[0x1c] = bVar1 * auVar14[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar20[0x1d] = bVar1 * auVar14[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar20[0x1e] = bVar1 * auVar14[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar20[0x1f] = bVar1 * auVar14[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar20[0x20] = bVar1 * auVar14[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar20[0x21] = bVar1 * auVar14[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar20[0x22] = bVar1 * auVar14[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar20[0x23] = bVar1 * auVar14[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar20[0x24] = bVar1 * auVar14[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar20[0x25] = bVar1 * auVar14[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar20[0x26] = bVar1 * auVar14[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar20[0x27] = bVar1 * auVar14[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar20[0x28] = bVar1 * auVar14[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar20[0x29] = bVar1 * auVar14[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar20[0x2a] = bVar1 * auVar14[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar20[0x2b] = bVar1 * auVar14[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar20[0x2c] = bVar1 * auVar14[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar20[0x2d] = bVar1 * auVar14[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar20[0x2e] = bVar1 * auVar14[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar20[0x2f] = bVar1 * auVar14[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar20[0x30] = bVar1 * auVar14[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar20[0x31] = bVar1 * auVar14[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar20[0x32] = bVar1 * auVar14[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar20[0x33] = bVar1 * auVar14[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar20[0x34] = bVar1 * auVar14[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar20[0x35] = bVar1 * auVar14[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar20[0x36] = bVar1 * auVar14[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar20[0x37] = bVar1 * auVar14[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar20[0x38] = (bVar8 & 1) * auVar14[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar20[0x39] = bVar1 * auVar14[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar20[0x3a] = bVar1 * auVar14[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar20[0x3b] = bVar1 * auVar14[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar20[0x3c] = bVar1 * auVar14[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar20[0x3d] = bVar1 * auVar14[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar20[0x3e] = bVar1 * auVar14[0x3e] | !bVar1 * auVar16[0x3e];
      auVar20[0x3f] =
           -((char)bVar8 >> 7) * auVar14[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5780 = vmovdqa64_avx512f(auVar13);
      local_57c0 = vmovdqa64_avx512f(auVar20);
      auVar13 = vmovdqa64_avx512f(local_57c0);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5780);
      vmovdqa64_avx512f(auVar14);
      first_04[1] = in_stack_ffffffffffff8c40._0_8_;
      first_04[2] = in_stack_ffffffffffff8c40._8_8_;
      first_04[3] = in_stack_ffffffffffff8c40._16_8_;
      first_04[4] = in_stack_ffffffffffff8c40._24_8_;
      first_04[5] = in_stack_ffffffffffff8c40._32_8_;
      first_04[6] = in_stack_ffffffffffff8c40._40_8_;
      first_04[7] = in_stack_ffffffffffff8c40._48_8_;
      first_04[0] = in_stack_ffffffffffff8c38;
      second_04[1] = in_stack_ffffffffffff8c00._0_8_;
      second_04[2] = in_stack_ffffffffffff8c00._8_8_;
      second_04[3] = in_stack_ffffffffffff8c00._16_8_;
      second_04[4] = in_stack_ffffffffffff8c00._24_8_;
      second_04[5] = in_stack_ffffffffffff8c00._32_8_;
      second_04[6] = in_stack_ffffffffffff8c00._40_8_;
      second_04[7] = in_stack_ffffffffffff8c00._48_8_;
      second_04[0] = auVar13._56_8_;
      maddubs_epi16(first_04,second_04);
      local_5680 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(local_4d30[6]);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_5840 = vmovdqa64_avx512f(auVar14);
      local_5880 = vmovdqa64_avx512f(auVar15);
      local_58c0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_58c0);
      local_3240 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5880);
      local_3280 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5840);
      local_32c0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_32c0);
      auVar15 = vmovdqa64_avx512f(local_3280);
      auVar16 = vmovdqa64_avx512f(local_3240);
      local_30c0 = vmovdqa64_avx512f(auVar14);
      local_30c8 = local_4d88;
      local_3140 = vmovdqa64_avx512f(auVar15);
      local_3180 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_3140);
      auVar15 = vmovdqa64_avx512f(local_3180);
      local_31c0 = vmovdqa64_avx512f(auVar14);
      local_3200 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_3200);
      local_a40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_31c0);
      local_a80 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_a80);
      auVar15 = vmovdqa64_avx512f(local_a40);
      local_9c0 = vmovdqa64_avx512f(auVar14);
      local_a00 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_9c0);
      auVar15 = vmovdqa64_avx512f(local_a00);
      auVar16 = vmovdqa64_avx512f(local_30c0);
      auVar14 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar21[0] = bVar1 * auVar14[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar21[1] = bVar1 * auVar14[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar21[2] = bVar1 * auVar14[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar21[3] = bVar1 * auVar14[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar21[4] = bVar1 * auVar14[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar21[5] = bVar1 * auVar14[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar21[6] = bVar1 * auVar14[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar21[7] = bVar1 * auVar14[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar21[8] = bVar1 * auVar14[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar21[9] = bVar1 * auVar14[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar21[10] = bVar1 * auVar14[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar21[0xb] = bVar1 * auVar14[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar21[0xc] = bVar1 * auVar14[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar21[0xd] = bVar1 * auVar14[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar21[0xe] = bVar1 * auVar14[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar21[0xf] = bVar1 * auVar14[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar21[0x10] = bVar1 * auVar14[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar21[0x11] = bVar1 * auVar14[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar21[0x12] = bVar1 * auVar14[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar21[0x13] = bVar1 * auVar14[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar21[0x14] = bVar1 * auVar14[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar21[0x15] = bVar1 * auVar14[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar21[0x16] = bVar1 * auVar14[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar21[0x17] = bVar1 * auVar14[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar21[0x18] = bVar1 * auVar14[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar21[0x19] = bVar1 * auVar14[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar21[0x1a] = bVar1 * auVar14[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar21[0x1b] = bVar1 * auVar14[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar21[0x1c] = bVar1 * auVar14[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar21[0x1d] = bVar1 * auVar14[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar21[0x1e] = bVar1 * auVar14[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar21[0x1f] = bVar1 * auVar14[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar21[0x20] = bVar1 * auVar14[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar21[0x21] = bVar1 * auVar14[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar21[0x22] = bVar1 * auVar14[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar21[0x23] = bVar1 * auVar14[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar21[0x24] = bVar1 * auVar14[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar21[0x25] = bVar1 * auVar14[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar21[0x26] = bVar1 * auVar14[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar21[0x27] = bVar1 * auVar14[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar21[0x28] = bVar1 * auVar14[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar21[0x29] = bVar1 * auVar14[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar21[0x2a] = bVar1 * auVar14[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar21[0x2b] = bVar1 * auVar14[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar21[0x2c] = bVar1 * auVar14[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar21[0x2d] = bVar1 * auVar14[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar21[0x2e] = bVar1 * auVar14[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar21[0x2f] = bVar1 * auVar14[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar21[0x30] = bVar1 * auVar14[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar21[0x31] = bVar1 * auVar14[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar21[0x32] = bVar1 * auVar14[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar21[0x33] = bVar1 * auVar14[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar21[0x34] = bVar1 * auVar14[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar21[0x35] = bVar1 * auVar14[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar21[0x36] = bVar1 * auVar14[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar21[0x37] = bVar1 * auVar14[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar21[0x38] = (bVar8 & 1) * auVar14[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar21[0x39] = bVar1 * auVar14[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar21[0x3a] = bVar1 * auVar14[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar21[0x3b] = bVar1 * auVar14[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar21[0x3c] = bVar1 * auVar14[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar21[0x3d] = bVar1 * auVar14[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar21[0x3e] = bVar1 * auVar14[0x3e] | !bVar1 * auVar16[0x3e];
      auVar21[0x3f] =
           -((char)bVar8 >> 7) * auVar14[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5900 = vmovdqa64_avx512f(auVar13);
      local_5940 = vmovdqa64_avx512f(auVar21);
      auVar13 = vmovdqa64_avx512f(local_5940);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5900);
      vmovdqa64_avx512f(auVar14);
      first_05[1] = in_stack_ffffffffffff8c40._0_8_;
      first_05[2] = in_stack_ffffffffffff8c40._8_8_;
      first_05[3] = in_stack_ffffffffffff8c40._16_8_;
      first_05[4] = in_stack_ffffffffffff8c40._24_8_;
      first_05[5] = in_stack_ffffffffffff8c40._32_8_;
      first_05[6] = in_stack_ffffffffffff8c40._40_8_;
      first_05[7] = in_stack_ffffffffffff8c40._48_8_;
      first_05[0] = in_stack_ffffffffffff8c38;
      second_05[1] = in_stack_ffffffffffff8c00._0_8_;
      second_05[2] = in_stack_ffffffffffff8c00._8_8_;
      second_05[3] = in_stack_ffffffffffff8c00._16_8_;
      second_05[4] = in_stack_ffffffffffff8c00._24_8_;
      second_05[5] = in_stack_ffffffffffff8c00._32_8_;
      second_05[6] = in_stack_ffffffffffff8c00._40_8_;
      second_05[7] = in_stack_ffffffffffff8c00._48_8_;
      second_05[0] = auVar13._56_8_;
      maddubs_epi16(first_05,second_05);
      local_5800 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(local_4e80);
      auVar14 = vmovdqa64_avx512f(local_4d30[7]);
      auVar15 = vmovdqa64_avx512f(local_4d00);
      local_59c0 = vmovdqa64_avx512f(auVar14);
      local_5a00 = vmovdqa64_avx512f(auVar15);
      local_5a40 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5a40);
      local_3480 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5a00);
      local_34c0 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_59c0);
      local_3500 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_3500);
      auVar15 = vmovdqa64_avx512f(local_34c0);
      auVar16 = vmovdqa64_avx512f(local_3480);
      local_3300 = vmovdqa64_avx512f(auVar14);
      local_3308 = local_4d88;
      local_3380 = vmovdqa64_avx512f(auVar15);
      local_33c0 = vmovdqa64_avx512f(auVar16);
      auVar14 = vmovdqa64_avx512f(local_3380);
      auVar15 = vmovdqa64_avx512f(local_33c0);
      local_3400 = vmovdqa64_avx512f(auVar14);
      local_3440 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_3440);
      local_940 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_3400);
      local_980 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_980);
      auVar15 = vmovdqa64_avx512f(local_940);
      local_8c0 = vmovdqa64_avx512f(auVar14);
      local_900 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_8c0);
      auVar15 = vmovdqa64_avx512f(local_900);
      auVar16 = vmovdqa64_avx512f(local_3300);
      auVar14 = vpsubb_avx512bw(auVar14,auVar15);
      bVar1 = (bool)((byte)local_4d88 & 1);
      auVar22[0] = bVar1 * auVar14[0] | !bVar1 * auVar16[0];
      bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
      auVar22[1] = bVar1 * auVar14[1] | !bVar1 * auVar16[1];
      bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
      auVar22[2] = bVar1 * auVar14[2] | !bVar1 * auVar16[2];
      bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
      auVar22[3] = bVar1 * auVar14[3] | !bVar1 * auVar16[3];
      bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
      auVar22[4] = bVar1 * auVar14[4] | !bVar1 * auVar16[4];
      bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
      auVar22[5] = bVar1 * auVar14[5] | !bVar1 * auVar16[5];
      bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
      auVar22[6] = bVar1 * auVar14[6] | !bVar1 * auVar16[6];
      bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
      auVar22[7] = bVar1 * auVar14[7] | !bVar1 * auVar16[7];
      bVar1 = (bool)((byte)(local_4d88 >> 8) & 1);
      auVar22[8] = bVar1 * auVar14[8] | !bVar1 * auVar16[8];
      bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
      auVar22[9] = bVar1 * auVar14[9] | !bVar1 * auVar16[9];
      bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
      auVar22[10] = bVar1 * auVar14[10] | !bVar1 * auVar16[10];
      bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
      auVar22[0xb] = bVar1 * auVar14[0xb] | !bVar1 * auVar16[0xb];
      bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
      auVar22[0xc] = bVar1 * auVar14[0xc] | !bVar1 * auVar16[0xc];
      bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
      auVar22[0xd] = bVar1 * auVar14[0xd] | !bVar1 * auVar16[0xd];
      bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
      auVar22[0xe] = bVar1 * auVar14[0xe] | !bVar1 * auVar16[0xe];
      bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
      auVar22[0xf] = bVar1 * auVar14[0xf] | !bVar1 * auVar16[0xf];
      bVar1 = (bool)((byte)(local_4d88 >> 0x10) & 1);
      auVar22[0x10] = bVar1 * auVar14[0x10] | !bVar1 * auVar16[0x10];
      bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
      auVar22[0x11] = bVar1 * auVar14[0x11] | !bVar1 * auVar16[0x11];
      bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
      auVar22[0x12] = bVar1 * auVar14[0x12] | !bVar1 * auVar16[0x12];
      bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
      auVar22[0x13] = bVar1 * auVar14[0x13] | !bVar1 * auVar16[0x13];
      bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
      auVar22[0x14] = bVar1 * auVar14[0x14] | !bVar1 * auVar16[0x14];
      bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
      auVar22[0x15] = bVar1 * auVar14[0x15] | !bVar1 * auVar16[0x15];
      bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
      auVar22[0x16] = bVar1 * auVar14[0x16] | !bVar1 * auVar16[0x16];
      bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
      auVar22[0x17] = bVar1 * auVar14[0x17] | !bVar1 * auVar16[0x17];
      bVar1 = (bool)((byte)(local_4d88 >> 0x18) & 1);
      auVar22[0x18] = bVar1 * auVar14[0x18] | !bVar1 * auVar16[0x18];
      bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
      auVar22[0x19] = bVar1 * auVar14[0x19] | !bVar1 * auVar16[0x19];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
      auVar22[0x1a] = bVar1 * auVar14[0x1a] | !bVar1 * auVar16[0x1a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
      auVar22[0x1b] = bVar1 * auVar14[0x1b] | !bVar1 * auVar16[0x1b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
      auVar22[0x1c] = bVar1 * auVar14[0x1c] | !bVar1 * auVar16[0x1c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
      auVar22[0x1d] = bVar1 * auVar14[0x1d] | !bVar1 * auVar16[0x1d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
      auVar22[0x1e] = bVar1 * auVar14[0x1e] | !bVar1 * auVar16[0x1e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
      auVar22[0x1f] = bVar1 * auVar14[0x1f] | !bVar1 * auVar16[0x1f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x20) & 1);
      auVar22[0x20] = bVar1 * auVar14[0x20] | !bVar1 * auVar16[0x20];
      bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
      auVar22[0x21] = bVar1 * auVar14[0x21] | !bVar1 * auVar16[0x21];
      bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
      auVar22[0x22] = bVar1 * auVar14[0x22] | !bVar1 * auVar16[0x22];
      bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
      auVar22[0x23] = bVar1 * auVar14[0x23] | !bVar1 * auVar16[0x23];
      bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
      auVar22[0x24] = bVar1 * auVar14[0x24] | !bVar1 * auVar16[0x24];
      bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
      auVar22[0x25] = bVar1 * auVar14[0x25] | !bVar1 * auVar16[0x25];
      bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
      auVar22[0x26] = bVar1 * auVar14[0x26] | !bVar1 * auVar16[0x26];
      bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
      auVar22[0x27] = bVar1 * auVar14[0x27] | !bVar1 * auVar16[0x27];
      bVar1 = (bool)((byte)(local_4d88 >> 0x28) & 1);
      auVar22[0x28] = bVar1 * auVar14[0x28] | !bVar1 * auVar16[0x28];
      bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
      auVar22[0x29] = bVar1 * auVar14[0x29] | !bVar1 * auVar16[0x29];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
      auVar22[0x2a] = bVar1 * auVar14[0x2a] | !bVar1 * auVar16[0x2a];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
      auVar22[0x2b] = bVar1 * auVar14[0x2b] | !bVar1 * auVar16[0x2b];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
      auVar22[0x2c] = bVar1 * auVar14[0x2c] | !bVar1 * auVar16[0x2c];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
      auVar22[0x2d] = bVar1 * auVar14[0x2d] | !bVar1 * auVar16[0x2d];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
      auVar22[0x2e] = bVar1 * auVar14[0x2e] | !bVar1 * auVar16[0x2e];
      bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
      auVar22[0x2f] = bVar1 * auVar14[0x2f] | !bVar1 * auVar16[0x2f];
      bVar1 = (bool)((byte)(local_4d88 >> 0x30) & 1);
      auVar22[0x30] = bVar1 * auVar14[0x30] | !bVar1 * auVar16[0x30];
      bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
      auVar22[0x31] = bVar1 * auVar14[0x31] | !bVar1 * auVar16[0x31];
      bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
      auVar22[0x32] = bVar1 * auVar14[0x32] | !bVar1 * auVar16[0x32];
      bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
      auVar22[0x33] = bVar1 * auVar14[0x33] | !bVar1 * auVar16[0x33];
      bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
      auVar22[0x34] = bVar1 * auVar14[0x34] | !bVar1 * auVar16[0x34];
      bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
      auVar22[0x35] = bVar1 * auVar14[0x35] | !bVar1 * auVar16[0x35];
      bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
      auVar22[0x36] = bVar1 * auVar14[0x36] | !bVar1 * auVar16[0x36];
      bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
      auVar22[0x37] = bVar1 * auVar14[0x37] | !bVar1 * auVar16[0x37];
      bVar8 = (byte)(local_4d88 >> 0x38);
      auVar22[0x38] = (bVar8 & 1) * auVar14[0x38] | !(bool)(bVar8 & 1) * auVar16[0x38];
      bVar1 = (bool)(bVar8 >> 1 & 1);
      auVar22[0x39] = bVar1 * auVar14[0x39] | !bVar1 * auVar16[0x39];
      bVar1 = (bool)(bVar8 >> 2 & 1);
      auVar22[0x3a] = bVar1 * auVar14[0x3a] | !bVar1 * auVar16[0x3a];
      bVar1 = (bool)(bVar8 >> 3 & 1);
      auVar22[0x3b] = bVar1 * auVar14[0x3b] | !bVar1 * auVar16[0x3b];
      bVar1 = (bool)(bVar8 >> 4 & 1);
      auVar22[0x3c] = bVar1 * auVar14[0x3c] | !bVar1 * auVar16[0x3c];
      bVar1 = (bool)(bVar8 >> 5 & 1);
      auVar22[0x3d] = bVar1 * auVar14[0x3d] | !bVar1 * auVar16[0x3d];
      bVar1 = (bool)(bVar8 >> 6 & 1);
      auVar22[0x3e] = bVar1 * auVar14[0x3e] | !bVar1 * auVar16[0x3e];
      auVar22[0x3f] =
           -((char)bVar8 >> 7) * auVar14[0x3f] | !(bool)-((char)bVar8 >> 7) * auVar16[0x3f];
      local_5a80 = vmovdqa64_avx512f(auVar13);
      local_5ac0 = vmovdqa64_avx512f(auVar22);
      auVar13 = vmovdqa64_avx512f(local_5ac0);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(local_5a80);
      auVar14 = vmovdqa64_avx512f(auVar15);
      first_06[1] = in_stack_ffffffffffff8c40._0_8_;
      first_06[2] = in_stack_ffffffffffff8c40._8_8_;
      first_06[3] = in_stack_ffffffffffff8c40._16_8_;
      first_06[4] = in_stack_ffffffffffff8c40._24_8_;
      first_06[5] = in_stack_ffffffffffff8c40._32_8_;
      first_06[6] = in_stack_ffffffffffff8c40._40_8_;
      first_06[7] = in_stack_ffffffffffff8c40._48_8_;
      first_06[0] = in_stack_ffffffffffff8c38;
      second_06[1] = in_stack_ffffffffffff8c00._0_8_;
      second_06[2] = in_stack_ffffffffffff8c00._8_8_;
      second_06[3] = in_stack_ffffffffffff8c00._16_8_;
      second_06[4] = in_stack_ffffffffffff8c00._24_8_;
      second_06[5] = in_stack_ffffffffffff8c00._32_8_;
      second_06[6] = in_stack_ffffffffffff8c00._40_8_;
      second_06[7] = in_stack_ffffffffffff8c00._48_8_;
      second_06[0] = auVar13._56_8_;
      maddubs_epi16(first_06,second_06);
      local_5980 = vmovdqa64_avx512f(auVar15);
      pauVar11 = local_4d30;
      while (local_4d20 = local_4d20 + 1, local_4d30 = pauVar11 + 8, local_4d20 != local_4d28) {
        auVar13 = vmovdqa64_avx512f(*local_4d20);
        local_4d80 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(*local_4d30);
        auVar13 = vmovdqa64_avx512f(auVar13);
        auVar15 = vmovdqa64_avx512f(pauVar11[9]);
        auVar15 = vmovdqa64_avx512f(auVar15);
        auVar16 = vmovdqa64_avx512f(pauVar11[10]);
        auVar16 = vmovdqa64_avx512f(auVar16);
        auVar17 = vmovdqa64_avx512f(pauVar11[0xb]);
        auVar17 = vmovdqa64_avx512f(auVar17);
        auVar18 = vmovdqa64_avx512f(pauVar11[0xc]);
        auVar18 = vmovdqa64_avx512f(auVar18);
        auVar19 = vmovdqa64_avx512f(pauVar11[0xd]);
        auVar19 = vmovdqa64_avx512f(auVar19);
        auVar20 = vmovdqa64_avx512f(pauVar11[0xe]);
        auVar20 = vmovdqa64_avx512f(auVar20);
        auVar21 = vmovdqa64_avx512f(pauVar11[0xf]);
        auVar21 = vmovdqa64_avx512f(auVar21);
        auVar22 = vmovdqa64_avx512f(local_4d80);
        local_4b81 = 0x80;
        auVar23 = vpbroadcastb_avx512bw(ZEXT116(0x80));
        local_4c00 = vmovdqa64_avx512f(auVar23);
        auVar23 = vmovdqa64_avx512f(local_4c00);
        local_5d00 = vmovdqa64_avx512f(auVar22);
        local_5d40 = vmovdqa64_avx512f(auVar23);
        auVar22 = vmovdqa64_avx512f(local_5d40);
        local_4ac0 = vmovdqa64_avx512f(auVar22);
        auVar22 = vmovdqa64_avx512f(local_5d00);
        local_4b00 = vmovdqa64_avx512f(auVar22);
        auVar22 = vmovdqa64_avx512f(local_4b00);
        auVar23 = vmovdqa64_avx512f(local_4ac0);
        local_49c0 = vmovdqa64_avx512f(auVar22);
        local_4a00 = vmovdqa64_avx512f(auVar23);
        auVar22 = vmovdqa64_avx512f(local_49c0);
        auVar23 = vmovdqa64_avx512f(local_4a00);
        local_4a40 = vmovdqa64_avx512f(auVar22);
        local_4a80 = vmovdqa64_avx512f(auVar23);
        auVar22 = vmovdqa64_avx512f(local_4a80);
        local_1140 = vmovdqa64_avx512f(auVar22);
        auVar22 = vmovdqa64_avx512f(local_4a40);
        local_1180 = vmovdqa64_avx512f(auVar22);
        auVar22 = vmovdqa64_avx512f(local_1180);
        auVar23 = vmovdqa64_avx512f(local_1140);
        local_10c0 = vmovdqa64_avx512f(auVar22);
        local_1100 = vmovdqa64_avx512f(auVar23);
        auVar22 = vmovdqa64_avx512f(local_10c0);
        auVar23 = vmovdqa64_avx512f(local_1100);
        auVar22 = vpandq_avx512f(auVar22,auVar23);
        local_12c0 = vmovdqa64_avx512f(ZEXT1664(ZEXT816(0) << 0x40));
        auVar23 = vmovdqa64_avx512f(local_12c0);
        local_4d88 = vpcmpb_avx512bw(auVar22,auVar23,4);
        auVar22 = vmovdqa64_avx512f(local_4d80);
        local_5d80 = vmovdqa64_avx512f(auVar22);
        auVar22 = vmovdqa64_avx512f(local_5d80);
        local_4800 = vmovdqa64_avx512f(auVar22);
        auVar22 = vmovdqa64_avx512f(local_4800);
        local_47c0 = vmovdqa64_avx512f(auVar22);
        auVar22 = vpabsb_avx512bw(local_47c0);
        local_4e80 = vmovdqa64_avx512f(auVar22);
        auVar13 = vmovdqa64_avx512f(auVar13);
        auVar22 = vmovdqa64_avx512f(local_4d00);
        local_5dc0 = vmovdqa64_avx512f(auVar13);
        local_5e00 = vmovdqa64_avx512f(auVar22);
        local_5e40 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5e40);
        local_36c0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5e00);
        local_3700 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5dc0);
        local_3740 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3740);
        auVar22 = vmovdqa64_avx512f(local_3700);
        auVar23 = vmovdqa64_avx512f(local_36c0);
        local_3540 = vmovdqa64_avx512f(auVar13);
        local_35c0 = vmovdqa64_avx512f(auVar22);
        local_3600 = vmovdqa64_avx512f(auVar23);
        auVar13 = vmovdqa64_avx512f(local_35c0);
        auVar22 = vmovdqa64_avx512f(local_3600);
        local_3640 = vmovdqa64_avx512f(auVar13);
        local_3680 = vmovdqa64_avx512f(auVar22);
        auVar13 = vmovdqa64_avx512f(local_3680);
        local_840 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3640);
        local_880 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_880);
        auVar22 = vmovdqa64_avx512f(local_840);
        local_7c0 = vmovdqa64_avx512f(auVar13);
        local_800 = vmovdqa64_avx512f(auVar22);
        auVar13 = vmovdqa64_avx512f(local_7c0);
        auVar22 = vmovdqa64_avx512f(local_800);
        auVar23 = vmovdqa64_avx512f(local_3540);
        auVar13 = vpsubb_avx512bw(auVar13,auVar22);
        bVar8 = (byte)local_4d88;
        auVar24[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar23[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar24[1] = bVar1 * auVar13[1] | !bVar1 * auVar23[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar24[2] = bVar1 * auVar13[2] | !bVar1 * auVar23[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar24[3] = bVar1 * auVar13[3] | !bVar1 * auVar23[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar24[4] = bVar1 * auVar13[4] | !bVar1 * auVar23[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar24[5] = bVar1 * auVar13[5] | !bVar1 * auVar23[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar24[6] = bVar1 * auVar13[6] | !bVar1 * auVar23[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar24[7] = bVar1 * auVar13[7] | !bVar1 * auVar23[7];
        bVar2 = (byte)(local_4d88 >> 8);
        auVar24[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar23[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar24[9] = bVar1 * auVar13[9] | !bVar1 * auVar23[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar24[10] = bVar1 * auVar13[10] | !bVar1 * auVar23[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar24[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar23[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar24[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar23[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar24[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar23[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar24[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar23[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar24[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar23[0xf];
        bVar3 = (byte)(local_4d88 >> 0x10);
        auVar24[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar23[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar24[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar23[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar24[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar23[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar24[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar23[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar24[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar23[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar24[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar23[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar24[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar23[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar24[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar23[0x17];
        bVar4 = (byte)(local_4d88 >> 0x18);
        auVar24[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar23[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar24[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar23[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar24[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar23[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar24[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar23[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar24[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar23[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar24[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar23[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar24[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar23[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar24[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar23[0x1f];
        bVar5 = (byte)(local_4d88 >> 0x20);
        auVar24[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar23[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar24[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar23[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar24[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar23[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar24[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar23[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar24[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar23[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar24[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar23[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar24[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar23[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar24[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar23[0x27];
        bVar6 = (byte)(local_4d88 >> 0x28);
        auVar24[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar23[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar24[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar23[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar24[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar23[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar24[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar23[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar24[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar23[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar24[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar23[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar24[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar23[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar24[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar23[0x2f];
        bVar7 = (byte)(local_4d88 >> 0x30);
        auVar24[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar23[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar24[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar23[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar24[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar23[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar24[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar23[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar24[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar23[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar24[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar23[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar24[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar23[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar24[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar23[0x37];
        bVar9 = (byte)(local_4d88 >> 0x38);
        auVar24[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar23[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar24[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar23[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar24[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar23[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar24[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar23[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar24[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar23[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar24[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar23[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar24[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar23[0x3e];
        cVar10 = (char)bVar9 >> 7;
        auVar24[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar23[0x3f];
        local_5b00 = vmovdqa64_avx512f(auVar24);
        auVar13 = vmovdqa64_avx512f(auVar15);
        auVar15 = vmovdqa64_avx512f(local_4d00);
        local_5e80 = vmovdqa64_avx512f(auVar13);
        local_5ec0 = vmovdqa64_avx512f(auVar15);
        local_5f00 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5f00);
        local_3900 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5ec0);
        local_3940 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5e80);
        local_3980 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3980);
        auVar15 = vmovdqa64_avx512f(local_3940);
        auVar22 = vmovdqa64_avx512f(local_3900);
        local_3780 = vmovdqa64_avx512f(auVar13);
        local_3800 = vmovdqa64_avx512f(auVar15);
        local_3840 = vmovdqa64_avx512f(auVar22);
        auVar13 = vmovdqa64_avx512f(local_3800);
        auVar15 = vmovdqa64_avx512f(local_3840);
        local_3880 = vmovdqa64_avx512f(auVar13);
        local_38c0 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_38c0);
        local_740 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3880);
        local_780 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_780);
        auVar15 = vmovdqa64_avx512f(local_740);
        local_6c0 = vmovdqa64_avx512f(auVar13);
        local_700 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_6c0);
        auVar15 = vmovdqa64_avx512f(local_700);
        auVar22 = vmovdqa64_avx512f(local_3780);
        auVar13 = vpsubb_avx512bw(auVar13,auVar15);
        auVar23[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar22[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar23[1] = bVar1 * auVar13[1] | !bVar1 * auVar22[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar23[2] = bVar1 * auVar13[2] | !bVar1 * auVar22[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar23[3] = bVar1 * auVar13[3] | !bVar1 * auVar22[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar23[4] = bVar1 * auVar13[4] | !bVar1 * auVar22[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar23[5] = bVar1 * auVar13[5] | !bVar1 * auVar22[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar23[6] = bVar1 * auVar13[6] | !bVar1 * auVar22[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar23[7] = bVar1 * auVar13[7] | !bVar1 * auVar22[7];
        auVar23[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar22[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar23[9] = bVar1 * auVar13[9] | !bVar1 * auVar22[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar23[10] = bVar1 * auVar13[10] | !bVar1 * auVar22[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar23[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar22[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar23[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar22[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar23[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar22[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar23[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar22[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar23[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar22[0xf];
        auVar23[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar22[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar23[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar22[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar23[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar22[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar23[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar22[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar23[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar22[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar23[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar22[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar23[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar22[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar23[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar22[0x17];
        auVar23[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar22[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar23[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar22[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar23[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar22[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar23[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar22[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar23[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar22[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar23[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar22[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar23[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar22[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar23[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar22[0x1f];
        auVar23[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar22[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar23[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar22[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar23[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar22[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar23[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar22[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar23[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar22[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar23[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar22[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar23[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar22[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar23[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar22[0x27];
        auVar23[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar22[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar23[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar22[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar23[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar22[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar23[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar22[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar23[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar22[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar23[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar22[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar23[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar22[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar23[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar22[0x2f];
        auVar23[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar22[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar23[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar22[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar23[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar22[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar23[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar22[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar23[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar22[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar23[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar22[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar23[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar22[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar23[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar22[0x37];
        auVar23[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar22[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar23[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar22[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar23[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar22[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar23[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar22[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar23[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar22[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar23[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar22[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar23[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar22[0x3e];
        auVar23[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar22[0x3f];
        local_5b40 = vmovdqa64_avx512f(auVar23);
        auVar13 = vmovdqa64_avx512f(auVar16);
        auVar15 = vmovdqa64_avx512f(local_4d00);
        local_5f40 = vmovdqa64_avx512f(auVar13);
        local_5f80 = vmovdqa64_avx512f(auVar15);
        local_5fc0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5fc0);
        local_3b40 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5f80);
        local_3b80 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5f40);
        local_3bc0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3bc0);
        auVar15 = vmovdqa64_avx512f(local_3b80);
        auVar16 = vmovdqa64_avx512f(local_3b40);
        local_39c0 = vmovdqa64_avx512f(auVar13);
        local_3a40 = vmovdqa64_avx512f(auVar15);
        local_3a80 = vmovdqa64_avx512f(auVar16);
        auVar13 = vmovdqa64_avx512f(local_3a40);
        auVar15 = vmovdqa64_avx512f(local_3a80);
        local_3ac0 = vmovdqa64_avx512f(auVar13);
        local_3b00 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_3b00);
        local_640 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3ac0);
        local_680 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_680);
        auVar15 = vmovdqa64_avx512f(local_640);
        local_5c0 = vmovdqa64_avx512f(auVar13);
        local_600 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_5c0);
        auVar15 = vmovdqa64_avx512f(local_600);
        auVar16 = vmovdqa64_avx512f(local_39c0);
        auVar13 = vpsubb_avx512bw(auVar13,auVar15);
        auVar25[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar16[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar25[1] = bVar1 * auVar13[1] | !bVar1 * auVar16[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar25[2] = bVar1 * auVar13[2] | !bVar1 * auVar16[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar25[3] = bVar1 * auVar13[3] | !bVar1 * auVar16[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar25[4] = bVar1 * auVar13[4] | !bVar1 * auVar16[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar25[5] = bVar1 * auVar13[5] | !bVar1 * auVar16[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar25[6] = bVar1 * auVar13[6] | !bVar1 * auVar16[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar25[7] = bVar1 * auVar13[7] | !bVar1 * auVar16[7];
        auVar25[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar16[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar25[9] = bVar1 * auVar13[9] | !bVar1 * auVar16[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar25[10] = bVar1 * auVar13[10] | !bVar1 * auVar16[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar25[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar16[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar25[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar16[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar25[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar16[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar25[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar16[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar25[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar16[0xf];
        auVar25[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar16[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar25[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar16[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar25[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar16[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar25[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar16[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar25[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar16[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar25[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar16[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar25[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar16[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar25[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar16[0x17];
        auVar25[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar16[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar25[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar16[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar25[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar16[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar25[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar16[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar25[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar16[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar25[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar16[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar25[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar16[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar25[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar16[0x1f];
        auVar25[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar16[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar25[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar16[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar25[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar16[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar25[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar16[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar25[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar16[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar25[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar16[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar25[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar16[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar25[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar16[0x27];
        auVar25[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar16[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar25[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar16[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar25[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar16[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar25[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar16[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar25[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar16[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar25[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar16[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar25[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar16[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar25[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar16[0x2f];
        auVar25[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar16[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar25[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar16[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar25[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar16[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar25[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar16[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar25[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar16[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar25[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar16[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar25[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar16[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar25[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar16[0x37];
        auVar25[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar16[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar25[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar16[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar25[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar16[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar25[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar16[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar25[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar16[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar25[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar16[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar25[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar16[0x3e];
        auVar25[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar16[0x3f];
        local_5b80 = vmovdqa64_avx512f(auVar25);
        auVar13 = vmovdqa64_avx512f(auVar17);
        auVar15 = vmovdqa64_avx512f(local_4d00);
        local_6000 = vmovdqa64_avx512f(auVar13);
        local_6040 = vmovdqa64_avx512f(auVar15);
        local_6080 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6080);
        local_3d80 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6040);
        local_3dc0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6000);
        local_3e00 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3e00);
        auVar15 = vmovdqa64_avx512f(local_3dc0);
        auVar16 = vmovdqa64_avx512f(local_3d80);
        local_3c00 = vmovdqa64_avx512f(auVar13);
        local_3c80 = vmovdqa64_avx512f(auVar15);
        local_3cc0 = vmovdqa64_avx512f(auVar16);
        auVar13 = vmovdqa64_avx512f(local_3c80);
        auVar15 = vmovdqa64_avx512f(local_3cc0);
        local_3d00 = vmovdqa64_avx512f(auVar13);
        local_3d40 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_3d40);
        local_540 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3d00);
        local_580 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_580);
        auVar15 = vmovdqa64_avx512f(local_540);
        local_4c0 = vmovdqa64_avx512f(auVar13);
        local_500 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_4c0);
        auVar15 = vmovdqa64_avx512f(local_500);
        auVar16 = vmovdqa64_avx512f(local_3c00);
        auVar13 = vpsubb_avx512bw(auVar13,auVar15);
        auVar26[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar16[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar26[1] = bVar1 * auVar13[1] | !bVar1 * auVar16[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar26[2] = bVar1 * auVar13[2] | !bVar1 * auVar16[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar26[3] = bVar1 * auVar13[3] | !bVar1 * auVar16[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar26[4] = bVar1 * auVar13[4] | !bVar1 * auVar16[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar26[5] = bVar1 * auVar13[5] | !bVar1 * auVar16[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar26[6] = bVar1 * auVar13[6] | !bVar1 * auVar16[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar26[7] = bVar1 * auVar13[7] | !bVar1 * auVar16[7];
        auVar26[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar16[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar26[9] = bVar1 * auVar13[9] | !bVar1 * auVar16[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar26[10] = bVar1 * auVar13[10] | !bVar1 * auVar16[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar26[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar16[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar26[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar16[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar26[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar16[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar26[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar16[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar26[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar16[0xf];
        auVar26[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar16[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar26[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar16[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar26[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar16[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar26[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar16[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar26[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar16[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar26[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar16[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar26[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar16[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar26[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar16[0x17];
        auVar26[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar16[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar26[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar16[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar26[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar16[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar26[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar16[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar26[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar16[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar26[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar16[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar26[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar16[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar26[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar16[0x1f];
        auVar26[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar16[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar26[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar16[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar26[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar16[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar26[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar16[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar26[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar16[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar26[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar16[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar26[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar16[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar26[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar16[0x27];
        auVar26[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar16[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar26[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar16[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar26[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar16[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar26[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar16[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar26[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar16[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar26[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar16[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar26[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar16[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar26[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar16[0x2f];
        auVar26[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar16[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar26[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar16[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar26[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar16[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar26[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar16[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar26[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar16[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar26[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar16[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar26[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar16[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar26[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar16[0x37];
        auVar26[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar16[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar26[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar16[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar26[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar16[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar26[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar16[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar26[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar16[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar26[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar16[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar26[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar16[0x3e];
        auVar26[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar16[0x3f];
        local_5bc0 = vmovdqa64_avx512f(auVar26);
        auVar13 = vmovdqa64_avx512f(auVar18);
        auVar15 = vmovdqa64_avx512f(local_4d00);
        local_60c0 = vmovdqa64_avx512f(auVar13);
        local_6100 = vmovdqa64_avx512f(auVar15);
        local_6140 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6140);
        local_3fc0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6100);
        local_4000 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_60c0);
        local_4040 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4040);
        auVar15 = vmovdqa64_avx512f(local_4000);
        auVar16 = vmovdqa64_avx512f(local_3fc0);
        local_3e40 = vmovdqa64_avx512f(auVar13);
        local_3ec0 = vmovdqa64_avx512f(auVar15);
        local_3f00 = vmovdqa64_avx512f(auVar16);
        auVar13 = vmovdqa64_avx512f(local_3ec0);
        auVar15 = vmovdqa64_avx512f(local_3f00);
        local_3f40 = vmovdqa64_avx512f(auVar13);
        local_3f80 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_3f80);
        local_440 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_3f40);
        local_480 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_480);
        auVar15 = vmovdqa64_avx512f(local_440);
        local_3c0 = vmovdqa64_avx512f(auVar13);
        local_400 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_3c0);
        auVar15 = vmovdqa64_avx512f(local_400);
        auVar16 = vmovdqa64_avx512f(local_3e40);
        auVar13 = vpsubb_avx512bw(auVar13,auVar15);
        auVar27[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar16[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar27[1] = bVar1 * auVar13[1] | !bVar1 * auVar16[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar27[2] = bVar1 * auVar13[2] | !bVar1 * auVar16[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar27[3] = bVar1 * auVar13[3] | !bVar1 * auVar16[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar27[4] = bVar1 * auVar13[4] | !bVar1 * auVar16[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar27[5] = bVar1 * auVar13[5] | !bVar1 * auVar16[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar27[6] = bVar1 * auVar13[6] | !bVar1 * auVar16[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar27[7] = bVar1 * auVar13[7] | !bVar1 * auVar16[7];
        auVar27[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar16[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar27[9] = bVar1 * auVar13[9] | !bVar1 * auVar16[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar27[10] = bVar1 * auVar13[10] | !bVar1 * auVar16[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar27[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar16[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar27[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar16[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar27[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar16[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar27[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar16[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar27[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar16[0xf];
        auVar27[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar16[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar27[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar16[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar27[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar16[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar27[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar16[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar27[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar16[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar27[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar16[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar27[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar16[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar27[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar16[0x17];
        auVar27[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar16[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar27[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar16[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar27[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar16[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar27[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar16[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar27[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar16[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar27[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar16[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar27[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar16[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar27[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar16[0x1f];
        auVar27[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar16[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar27[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar16[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar27[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar16[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar27[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar16[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar27[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar16[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar27[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar16[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar27[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar16[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar27[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar16[0x27];
        auVar27[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar16[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar27[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar16[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar27[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar16[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar27[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar16[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar27[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar16[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar27[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar16[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar27[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar16[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar27[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar16[0x2f];
        auVar27[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar16[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar27[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar16[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar27[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar16[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar27[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar16[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar27[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar16[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar27[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar16[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar27[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar16[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar27[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar16[0x37];
        auVar27[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar16[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar27[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar16[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar27[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar16[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar27[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar16[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar27[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar16[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar27[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar16[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar27[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar16[0x3e];
        auVar27[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar16[0x3f];
        local_5c00 = vmovdqa64_avx512f(auVar27);
        auVar13 = vmovdqa64_avx512f(auVar19);
        auVar15 = vmovdqa64_avx512f(local_4d00);
        local_6180 = vmovdqa64_avx512f(auVar13);
        local_61c0 = vmovdqa64_avx512f(auVar15);
        local_6200 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6200);
        local_4200 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_61c0);
        local_4240 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6180);
        local_4280 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4280);
        auVar15 = vmovdqa64_avx512f(local_4240);
        auVar16 = vmovdqa64_avx512f(local_4200);
        local_4080 = vmovdqa64_avx512f(auVar13);
        local_4100 = vmovdqa64_avx512f(auVar15);
        local_4140 = vmovdqa64_avx512f(auVar16);
        auVar13 = vmovdqa64_avx512f(local_4100);
        auVar15 = vmovdqa64_avx512f(local_4140);
        local_4180 = vmovdqa64_avx512f(auVar13);
        local_41c0 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_41c0);
        local_340 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4180);
        local_380 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_380);
        auVar15 = vmovdqa64_avx512f(local_340);
        local_2c0 = vmovdqa64_avx512f(auVar13);
        local_300 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_2c0);
        auVar15 = vmovdqa64_avx512f(local_300);
        auVar16 = vmovdqa64_avx512f(local_4080);
        auVar13 = vpsubb_avx512bw(auVar13,auVar15);
        auVar28[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar16[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar28[1] = bVar1 * auVar13[1] | !bVar1 * auVar16[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar28[2] = bVar1 * auVar13[2] | !bVar1 * auVar16[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar28[3] = bVar1 * auVar13[3] | !bVar1 * auVar16[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar28[4] = bVar1 * auVar13[4] | !bVar1 * auVar16[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar28[5] = bVar1 * auVar13[5] | !bVar1 * auVar16[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar28[6] = bVar1 * auVar13[6] | !bVar1 * auVar16[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar28[7] = bVar1 * auVar13[7] | !bVar1 * auVar16[7];
        auVar28[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar16[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar28[9] = bVar1 * auVar13[9] | !bVar1 * auVar16[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar28[10] = bVar1 * auVar13[10] | !bVar1 * auVar16[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar28[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar16[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar28[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar16[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar28[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar16[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar28[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar16[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar28[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar16[0xf];
        auVar28[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar16[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar28[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar16[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar28[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar16[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar28[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar16[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar28[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar16[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar28[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar16[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar28[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar16[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar28[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar16[0x17];
        auVar28[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar16[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar28[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar16[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar28[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar16[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar28[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar16[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar28[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar16[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar28[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar16[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar28[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar16[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar28[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar16[0x1f];
        auVar28[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar16[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar28[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar16[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar28[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar16[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar28[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar16[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar28[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar16[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar28[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar16[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar28[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar16[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar28[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar16[0x27];
        auVar28[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar16[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar28[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar16[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar28[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar16[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar28[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar16[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar28[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar16[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar28[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar16[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar28[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar16[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar28[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar16[0x2f];
        auVar28[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar16[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar28[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar16[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar28[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar16[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar28[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar16[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar28[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar16[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar28[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar16[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar28[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar16[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar28[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar16[0x37];
        auVar28[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar16[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar28[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar16[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar28[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar16[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar28[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar16[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar28[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar16[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar28[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar16[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar28[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar16[0x3e];
        auVar28[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar16[0x3f];
        local_5c40 = vmovdqa64_avx512f(auVar28);
        auVar13 = vmovdqa64_avx512f(auVar20);
        auVar15 = vmovdqa64_avx512f(local_4d00);
        local_6240 = vmovdqa64_avx512f(auVar13);
        local_6280 = vmovdqa64_avx512f(auVar15);
        local_62c0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_62c0);
        local_4440 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6280);
        local_4480 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6240);
        local_44c0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_44c0);
        auVar15 = vmovdqa64_avx512f(local_4480);
        auVar16 = vmovdqa64_avx512f(local_4440);
        local_42c0 = vmovdqa64_avx512f(auVar13);
        local_4340 = vmovdqa64_avx512f(auVar15);
        local_4380 = vmovdqa64_avx512f(auVar16);
        auVar13 = vmovdqa64_avx512f(local_4340);
        auVar15 = vmovdqa64_avx512f(local_4380);
        local_43c0 = vmovdqa64_avx512f(auVar13);
        local_4400 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_4400);
        local_240 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_43c0);
        local_280 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_280);
        auVar15 = vmovdqa64_avx512f(local_240);
        local_1c0 = vmovdqa64_avx512f(auVar13);
        local_200 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1c0);
        auVar15 = vmovdqa64_avx512f(local_200);
        auVar16 = vmovdqa64_avx512f(local_42c0);
        auVar13 = vpsubb_avx512bw(auVar13,auVar15);
        auVar29[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar16[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar29[1] = bVar1 * auVar13[1] | !bVar1 * auVar16[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar29[2] = bVar1 * auVar13[2] | !bVar1 * auVar16[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar29[3] = bVar1 * auVar13[3] | !bVar1 * auVar16[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar29[4] = bVar1 * auVar13[4] | !bVar1 * auVar16[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar29[5] = bVar1 * auVar13[5] | !bVar1 * auVar16[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar29[6] = bVar1 * auVar13[6] | !bVar1 * auVar16[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar29[7] = bVar1 * auVar13[7] | !bVar1 * auVar16[7];
        auVar29[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar16[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar29[9] = bVar1 * auVar13[9] | !bVar1 * auVar16[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar29[10] = bVar1 * auVar13[10] | !bVar1 * auVar16[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar29[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar16[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar29[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar16[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar29[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar16[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar29[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar16[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar29[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar16[0xf];
        auVar29[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar16[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar29[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar16[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar29[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar16[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar29[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar16[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar29[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar16[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar29[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar16[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar29[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar16[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar29[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar16[0x17];
        auVar29[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar16[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar29[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar16[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar29[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar16[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar29[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar16[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar29[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar16[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar29[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar16[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar29[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar16[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar29[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar16[0x1f];
        auVar29[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar16[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar29[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar16[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar29[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar16[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar29[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar16[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar29[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar16[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar29[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar16[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar29[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar16[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar29[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar16[0x27];
        auVar29[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar16[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar29[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar16[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar29[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar16[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar29[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar16[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar29[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar16[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar29[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar16[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar29[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar16[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar29[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar16[0x2f];
        auVar29[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar16[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar29[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar16[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar29[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar16[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar29[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar16[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar29[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar16[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar29[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar16[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar29[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar16[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar29[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar16[0x37];
        auVar29[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar16[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar29[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar16[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar29[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar16[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar29[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar16[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar29[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar16[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar29[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar16[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar29[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar16[0x3e];
        auVar29[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar16[0x3f];
        local_5c80 = vmovdqa64_avx512f(auVar29);
        auVar13 = vmovdqa64_avx512f(auVar21);
        auVar15 = vmovdqa64_avx512f(local_4d00);
        local_6300 = vmovdqa64_avx512f(auVar13);
        local_6340 = vmovdqa64_avx512f(auVar15);
        local_6380 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6380);
        local_4680 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6340);
        local_46c0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_6300);
        local_4700 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4700);
        auVar15 = vmovdqa64_avx512f(local_46c0);
        auVar16 = vmovdqa64_avx512f(local_4680);
        local_4500 = vmovdqa64_avx512f(auVar13);
        local_4580 = vmovdqa64_avx512f(auVar15);
        local_45c0 = vmovdqa64_avx512f(auVar16);
        auVar13 = vmovdqa64_avx512f(local_4580);
        auVar15 = vmovdqa64_avx512f(local_45c0);
        local_4600 = vmovdqa64_avx512f(auVar13);
        local_4640 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_4640);
        local_140 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4600);
        local_180 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_180);
        auVar15 = vmovdqa64_avx512f(local_140);
        local_c0 = vmovdqa64_avx512f(auVar13);
        local_100 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_c0);
        auVar15 = vmovdqa64_avx512f(local_100);
        auVar16 = vmovdqa64_avx512f(local_4500);
        auVar13 = vpsubb_avx512bw(auVar13,auVar15);
        auVar30[0] = (bVar8 & 1) * auVar13[0] | !(bool)(bVar8 & 1) * auVar16[0];
        bVar1 = (bool)((byte)(local_4d88 >> 1) & 1);
        auVar30[1] = bVar1 * auVar13[1] | !bVar1 * auVar16[1];
        bVar1 = (bool)((byte)(local_4d88 >> 2) & 1);
        auVar30[2] = bVar1 * auVar13[2] | !bVar1 * auVar16[2];
        bVar1 = (bool)((byte)(local_4d88 >> 3) & 1);
        auVar30[3] = bVar1 * auVar13[3] | !bVar1 * auVar16[3];
        bVar1 = (bool)((byte)(local_4d88 >> 4) & 1);
        auVar30[4] = bVar1 * auVar13[4] | !bVar1 * auVar16[4];
        bVar1 = (bool)((byte)(local_4d88 >> 5) & 1);
        auVar30[5] = bVar1 * auVar13[5] | !bVar1 * auVar16[5];
        bVar1 = (bool)((byte)(local_4d88 >> 6) & 1);
        auVar30[6] = bVar1 * auVar13[6] | !bVar1 * auVar16[6];
        bVar1 = (bool)((byte)(local_4d88 >> 7) & 1);
        auVar30[7] = bVar1 * auVar13[7] | !bVar1 * auVar16[7];
        auVar30[8] = (bVar2 & 1) * auVar13[8] | !(bool)(bVar2 & 1) * auVar16[8];
        bVar1 = (bool)((byte)(local_4d88 >> 9) & 1);
        auVar30[9] = bVar1 * auVar13[9] | !bVar1 * auVar16[9];
        bVar1 = (bool)((byte)(local_4d88 >> 10) & 1);
        auVar30[10] = bVar1 * auVar13[10] | !bVar1 * auVar16[10];
        bVar1 = (bool)((byte)(local_4d88 >> 0xb) & 1);
        auVar30[0xb] = bVar1 * auVar13[0xb] | !bVar1 * auVar16[0xb];
        bVar1 = (bool)((byte)(local_4d88 >> 0xc) & 1);
        auVar30[0xc] = bVar1 * auVar13[0xc] | !bVar1 * auVar16[0xc];
        bVar1 = (bool)((byte)(local_4d88 >> 0xd) & 1);
        auVar30[0xd] = bVar1 * auVar13[0xd] | !bVar1 * auVar16[0xd];
        bVar1 = (bool)((byte)(local_4d88 >> 0xe) & 1);
        auVar30[0xe] = bVar1 * auVar13[0xe] | !bVar1 * auVar16[0xe];
        bVar1 = (bool)((byte)(local_4d88 >> 0xf) & 1);
        auVar30[0xf] = bVar1 * auVar13[0xf] | !bVar1 * auVar16[0xf];
        auVar30[0x10] = (bVar3 & 1) * auVar13[0x10] | !(bool)(bVar3 & 1) * auVar16[0x10];
        bVar1 = (bool)((byte)(local_4d88 >> 0x11) & 1);
        auVar30[0x11] = bVar1 * auVar13[0x11] | !bVar1 * auVar16[0x11];
        bVar1 = (bool)((byte)(local_4d88 >> 0x12) & 1);
        auVar30[0x12] = bVar1 * auVar13[0x12] | !bVar1 * auVar16[0x12];
        bVar1 = (bool)((byte)(local_4d88 >> 0x13) & 1);
        auVar30[0x13] = bVar1 * auVar13[0x13] | !bVar1 * auVar16[0x13];
        bVar1 = (bool)((byte)(local_4d88 >> 0x14) & 1);
        auVar30[0x14] = bVar1 * auVar13[0x14] | !bVar1 * auVar16[0x14];
        bVar1 = (bool)((byte)(local_4d88 >> 0x15) & 1);
        auVar30[0x15] = bVar1 * auVar13[0x15] | !bVar1 * auVar16[0x15];
        bVar1 = (bool)((byte)(local_4d88 >> 0x16) & 1);
        auVar30[0x16] = bVar1 * auVar13[0x16] | !bVar1 * auVar16[0x16];
        bVar1 = (bool)((byte)(local_4d88 >> 0x17) & 1);
        auVar30[0x17] = bVar1 * auVar13[0x17] | !bVar1 * auVar16[0x17];
        auVar30[0x18] = (bVar4 & 1) * auVar13[0x18] | !(bool)(bVar4 & 1) * auVar16[0x18];
        bVar1 = (bool)((byte)(local_4d88 >> 0x19) & 1);
        auVar30[0x19] = bVar1 * auVar13[0x19] | !bVar1 * auVar16[0x19];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1a) & 1);
        auVar30[0x1a] = bVar1 * auVar13[0x1a] | !bVar1 * auVar16[0x1a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1b) & 1);
        auVar30[0x1b] = bVar1 * auVar13[0x1b] | !bVar1 * auVar16[0x1b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1c) & 1);
        auVar30[0x1c] = bVar1 * auVar13[0x1c] | !bVar1 * auVar16[0x1c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1d) & 1);
        auVar30[0x1d] = bVar1 * auVar13[0x1d] | !bVar1 * auVar16[0x1d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1e) & 1);
        auVar30[0x1e] = bVar1 * auVar13[0x1e] | !bVar1 * auVar16[0x1e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x1f) & 1);
        auVar30[0x1f] = bVar1 * auVar13[0x1f] | !bVar1 * auVar16[0x1f];
        auVar30[0x20] = (bVar5 & 1) * auVar13[0x20] | !(bool)(bVar5 & 1) * auVar16[0x20];
        bVar1 = (bool)((byte)(local_4d88 >> 0x21) & 1);
        auVar30[0x21] = bVar1 * auVar13[0x21] | !bVar1 * auVar16[0x21];
        bVar1 = (bool)((byte)(local_4d88 >> 0x22) & 1);
        auVar30[0x22] = bVar1 * auVar13[0x22] | !bVar1 * auVar16[0x22];
        bVar1 = (bool)((byte)(local_4d88 >> 0x23) & 1);
        auVar30[0x23] = bVar1 * auVar13[0x23] | !bVar1 * auVar16[0x23];
        bVar1 = (bool)((byte)(local_4d88 >> 0x24) & 1);
        auVar30[0x24] = bVar1 * auVar13[0x24] | !bVar1 * auVar16[0x24];
        bVar1 = (bool)((byte)(local_4d88 >> 0x25) & 1);
        auVar30[0x25] = bVar1 * auVar13[0x25] | !bVar1 * auVar16[0x25];
        bVar1 = (bool)((byte)(local_4d88 >> 0x26) & 1);
        auVar30[0x26] = bVar1 * auVar13[0x26] | !bVar1 * auVar16[0x26];
        bVar1 = (bool)((byte)(local_4d88 >> 0x27) & 1);
        auVar30[0x27] = bVar1 * auVar13[0x27] | !bVar1 * auVar16[0x27];
        auVar30[0x28] = (bVar6 & 1) * auVar13[0x28] | !(bool)(bVar6 & 1) * auVar16[0x28];
        bVar1 = (bool)((byte)(local_4d88 >> 0x29) & 1);
        auVar30[0x29] = bVar1 * auVar13[0x29] | !bVar1 * auVar16[0x29];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2a) & 1);
        auVar30[0x2a] = bVar1 * auVar13[0x2a] | !bVar1 * auVar16[0x2a];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2b) & 1);
        auVar30[0x2b] = bVar1 * auVar13[0x2b] | !bVar1 * auVar16[0x2b];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2c) & 1);
        auVar30[0x2c] = bVar1 * auVar13[0x2c] | !bVar1 * auVar16[0x2c];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2d) & 1);
        auVar30[0x2d] = bVar1 * auVar13[0x2d] | !bVar1 * auVar16[0x2d];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2e) & 1);
        auVar30[0x2e] = bVar1 * auVar13[0x2e] | !bVar1 * auVar16[0x2e];
        bVar1 = (bool)((byte)(local_4d88 >> 0x2f) & 1);
        auVar30[0x2f] = bVar1 * auVar13[0x2f] | !bVar1 * auVar16[0x2f];
        auVar30[0x30] = (bVar7 & 1) * auVar13[0x30] | !(bool)(bVar7 & 1) * auVar16[0x30];
        bVar1 = (bool)((byte)(local_4d88 >> 0x31) & 1);
        auVar30[0x31] = bVar1 * auVar13[0x31] | !bVar1 * auVar16[0x31];
        bVar1 = (bool)((byte)(local_4d88 >> 0x32) & 1);
        auVar30[0x32] = bVar1 * auVar13[0x32] | !bVar1 * auVar16[0x32];
        bVar1 = (bool)((byte)(local_4d88 >> 0x33) & 1);
        auVar30[0x33] = bVar1 * auVar13[0x33] | !bVar1 * auVar16[0x33];
        bVar1 = (bool)((byte)(local_4d88 >> 0x34) & 1);
        auVar30[0x34] = bVar1 * auVar13[0x34] | !bVar1 * auVar16[0x34];
        bVar1 = (bool)((byte)(local_4d88 >> 0x35) & 1);
        auVar30[0x35] = bVar1 * auVar13[0x35] | !bVar1 * auVar16[0x35];
        bVar1 = (bool)((byte)(local_4d88 >> 0x36) & 1);
        auVar30[0x36] = bVar1 * auVar13[0x36] | !bVar1 * auVar16[0x36];
        bVar1 = (bool)((byte)(local_4d88 >> 0x37) & 1);
        auVar30[0x37] = bVar1 * auVar13[0x37] | !bVar1 * auVar16[0x37];
        auVar30[0x38] = (bVar9 & 1) * auVar13[0x38] | !(bool)(bVar9 & 1) * auVar16[0x38];
        bVar1 = (bool)(bVar9 >> 1 & 1);
        auVar30[0x39] = bVar1 * auVar13[0x39] | !bVar1 * auVar16[0x39];
        bVar1 = (bool)(bVar9 >> 2 & 1);
        auVar30[0x3a] = bVar1 * auVar13[0x3a] | !bVar1 * auVar16[0x3a];
        bVar1 = (bool)(bVar9 >> 3 & 1);
        auVar30[0x3b] = bVar1 * auVar13[0x3b] | !bVar1 * auVar16[0x3b];
        bVar1 = (bool)(bVar9 >> 4 & 1);
        auVar30[0x3c] = bVar1 * auVar13[0x3c] | !bVar1 * auVar16[0x3c];
        bVar1 = (bool)(bVar9 >> 5 & 1);
        auVar30[0x3d] = bVar1 * auVar13[0x3d] | !bVar1 * auVar16[0x3d];
        bVar1 = (bool)(bVar9 >> 6 & 1);
        auVar30[0x3e] = bVar1 * auVar13[0x3e] | !bVar1 * auVar16[0x3e];
        auVar30[0x3f] = -cVar10 * auVar13[0x3f] | !(bool)-cVar10 * auVar16[0x3f];
        local_5cc0 = vmovdqa64_avx512f(auVar30);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5b00);
        local_63c0 = vmovdqa64_avx512f(auVar13);
        local_6400 = vmovdqa64_avx512f(auVar15);
        local_4508 = local_4d88;
        local_42c8 = local_4d88;
        local_4088 = local_4d88;
        local_3e48 = local_4d88;
        local_3c08 = local_4d88;
        local_39c8 = local_4d88;
        local_3788 = local_4d88;
        local_3548 = local_4d88;
        memcpy(local_1bc0,local_6400,0x40);
        memcpy(local_1c00,local_63c0,0x40);
        auVar13 = vmovdqa64_avx512f(local_1c00);
        auVar15 = vmovdqa64_avx512f(local_1bc0);
        local_1b40 = vmovdqa64_avx512f(auVar13);
        local_1b80 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1b40);
        auVar15 = vmovdqa64_avx512f(local_1b80);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5b00 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5b40);
        local_6440 = vmovdqa64_avx512f(auVar13);
        local_6480 = vmovdqa64_avx512f(auVar15);
        memcpy(local_1cc0,local_6480,0x40);
        memcpy(local_1d00,local_6440,0x40);
        auVar13 = vmovdqa64_avx512f(local_1d00);
        auVar15 = vmovdqa64_avx512f(local_1cc0);
        local_1c40 = vmovdqa64_avx512f(auVar13);
        local_1c80 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1c40);
        auVar15 = vmovdqa64_avx512f(local_1c80);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5b40 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5b80);
        local_64c0 = vmovdqa64_avx512f(auVar13);
        local_6500 = vmovdqa64_avx512f(auVar15);
        memcpy(local_1dc0,local_6500,0x40);
        memcpy(local_1e00,local_64c0,0x40);
        auVar13 = vmovdqa64_avx512f(local_1e00);
        auVar15 = vmovdqa64_avx512f(local_1dc0);
        local_1d40 = vmovdqa64_avx512f(auVar13);
        local_1d80 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1d40);
        auVar15 = vmovdqa64_avx512f(local_1d80);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5b80 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5bc0);
        local_6540 = vmovdqa64_avx512f(auVar13);
        local_6580 = vmovdqa64_avx512f(auVar15);
        memcpy(local_1ec0,local_6580,0x40);
        memcpy(local_1f00,local_6540,0x40);
        auVar13 = vmovdqa64_avx512f(local_1f00);
        auVar15 = vmovdqa64_avx512f(local_1ec0);
        local_1e40 = vmovdqa64_avx512f(auVar13);
        local_1e80 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1e40);
        auVar15 = vmovdqa64_avx512f(local_1e80);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5bc0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5c00);
        local_65c0 = vmovdqa64_avx512f(auVar13);
        local_6600 = vmovdqa64_avx512f(auVar15);
        memcpy(local_1fc0,local_6600,0x40);
        memcpy(local_2000,local_65c0,0x40);
        auVar13 = vmovdqa64_avx512f(local_2000);
        auVar15 = vmovdqa64_avx512f(local_1fc0);
        local_1f40 = vmovdqa64_avx512f(auVar13);
        local_1f80 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1f40);
        auVar15 = vmovdqa64_avx512f(local_1f80);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5c00 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5c40);
        local_6640 = vmovdqa64_avx512f(auVar13);
        local_6680 = vmovdqa64_avx512f(auVar15);
        memcpy(local_20c0,local_6680,0x40);
        memcpy(local_2100,local_6640,0x40);
        auVar13 = vmovdqa64_avx512f(local_2100);
        auVar15 = vmovdqa64_avx512f(local_20c0);
        local_2040 = vmovdqa64_avx512f(auVar13);
        local_2080 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_2040);
        auVar15 = vmovdqa64_avx512f(local_2080);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5c40 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5c80);
        local_66c0 = vmovdqa64_avx512f(auVar13);
        local_6700 = vmovdqa64_avx512f(auVar15);
        memcpy(local_21c0,local_6700,0x40);
        memcpy(local_2200,local_66c0,0x40);
        auVar13 = vmovdqa64_avx512f(local_2200);
        auVar15 = vmovdqa64_avx512f(local_21c0);
        local_2140 = vmovdqa64_avx512f(auVar13);
        local_2180 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_2140);
        auVar15 = vmovdqa64_avx512f(local_2180);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5c80 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4e80);
        auVar15 = vmovdqa64_avx512f(local_5cc0);
        local_6740 = vmovdqa64_avx512f(auVar13);
        local_6780 = vmovdqa64_avx512f(auVar15);
        memcpy(local_22c0,local_6780,0x40);
        memcpy(local_2300,local_6740,0x40);
        auVar13 = vmovdqa64_avx512f(local_2300);
        auVar15 = vmovdqa64_avx512f(local_22c0);
        local_2240 = vmovdqa64_avx512f(auVar13);
        local_2280 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_2240);
        auVar15 = vmovdqa64_avx512f(local_2280);
        auVar13 = vpmaddubsw_avx512bw(auVar13,auVar15);
        local_5cc0 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_4f00);
        auVar15 = vmovdqa64_avx512f(local_5b00);
        local_67c0 = vmovdqa64_avx512f(auVar13);
        local_6800 = vmovdqa64_avx512f(auVar15);
        memcpy(local_13c0,local_6800,0x40);
        memcpy(local_1400,local_67c0,0x40);
        auVar13 = vmovdqa64_avx512f(local_1400);
        auVar15 = vmovdqa64_avx512f(local_13c0);
        local_1340 = vmovdqa64_avx512f(auVar13);
        local_1380 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1340);
        auVar15 = vmovdqa64_avx512f(local_1380);
        auVar13 = vpaddsw_avx512bw(auVar13,auVar15);
        local_4f00 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5080);
        auVar15 = vmovdqa64_avx512f(local_5b40);
        local_6840 = vmovdqa64_avx512f(auVar13);
        local_6880 = vmovdqa64_avx512f(auVar15);
        memcpy(local_14c0,local_6880,0x40);
        memcpy(local_1500,local_6840,0x40);
        auVar13 = vmovdqa64_avx512f(local_1500);
        auVar15 = vmovdqa64_avx512f(local_14c0);
        local_1440 = vmovdqa64_avx512f(auVar13);
        local_1480 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1440);
        auVar15 = vmovdqa64_avx512f(local_1480);
        auVar13 = vpaddsw_avx512bw(auVar13,auVar15);
        local_5080 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5200);
        auVar15 = vmovdqa64_avx512f(local_5b80);
        local_68c0 = vmovdqa64_avx512f(auVar13);
        local_6900 = vmovdqa64_avx512f(auVar15);
        memcpy(local_15c0,local_6900,0x40);
        memcpy(local_1600,local_68c0,0x40);
        auVar13 = vmovdqa64_avx512f(local_1600);
        auVar15 = vmovdqa64_avx512f(local_15c0);
        local_1540 = vmovdqa64_avx512f(auVar13);
        local_1580 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1540);
        auVar15 = vmovdqa64_avx512f(local_1580);
        auVar13 = vpaddsw_avx512bw(auVar13,auVar15);
        local_5200 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5380);
        auVar15 = vmovdqa64_avx512f(local_5bc0);
        local_6940 = vmovdqa64_avx512f(auVar13);
        local_6980 = vmovdqa64_avx512f(auVar15);
        memcpy(local_16c0,local_6980,0x40);
        memcpy(local_1700,local_6940,0x40);
        auVar13 = vmovdqa64_avx512f(local_1700);
        auVar15 = vmovdqa64_avx512f(local_16c0);
        local_1640 = vmovdqa64_avx512f(auVar13);
        local_1680 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1640);
        auVar15 = vmovdqa64_avx512f(local_1680);
        auVar13 = vpaddsw_avx512bw(auVar13,auVar15);
        local_5380 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5500);
        auVar15 = vmovdqa64_avx512f(local_5c00);
        local_69c0 = vmovdqa64_avx512f(auVar13);
        local_6a00 = vmovdqa64_avx512f(auVar15);
        memcpy(local_17c0,local_6a00,0x40);
        memcpy(local_1800,local_69c0,0x40);
        auVar13 = vmovdqa64_avx512f(local_1800);
        auVar15 = vmovdqa64_avx512f(local_17c0);
        local_1740 = vmovdqa64_avx512f(auVar13);
        local_1780 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1740);
        auVar15 = vmovdqa64_avx512f(local_1780);
        auVar13 = vpaddsw_avx512bw(auVar13,auVar15);
        local_5500 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5680);
        auVar15 = vmovdqa64_avx512f(local_5c40);
        local_6a40 = vmovdqa64_avx512f(auVar13);
        local_6a80 = vmovdqa64_avx512f(auVar15);
        memcpy(local_18c0,local_6a80,0x40);
        memcpy(local_1900,local_6a40,0x40);
        auVar13 = vmovdqa64_avx512f(local_1900);
        auVar15 = vmovdqa64_avx512f(local_18c0);
        local_1840 = vmovdqa64_avx512f(auVar13);
        local_1880 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1840);
        auVar15 = vmovdqa64_avx512f(local_1880);
        auVar13 = vpaddsw_avx512bw(auVar13,auVar15);
        local_5680 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5800);
        auVar15 = vmovdqa64_avx512f(local_5c80);
        local_6ac0 = vmovdqa64_avx512f(auVar13);
        local_6b00 = vmovdqa64_avx512f(auVar15);
        memcpy(local_19c0,local_6b00,0x40);
        memcpy(local_1a00,local_6ac0,0x40);
        auVar13 = vmovdqa64_avx512f(local_1a00);
        auVar15 = vmovdqa64_avx512f(local_19c0);
        local_1940 = vmovdqa64_avx512f(auVar13);
        local_1980 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1940);
        auVar15 = vmovdqa64_avx512f(local_1980);
        auVar13 = vpaddsw_avx512bw(auVar13,auVar15);
        local_5800 = vmovdqa64_avx512f(auVar13);
        auVar13 = vmovdqa64_avx512f(local_5980);
        auVar15 = vmovdqa64_avx512f(local_5cc0);
        local_6b40 = vmovdqa64_avx512f(auVar13);
        local_6b80 = vmovdqa64_avx512f(auVar15);
        memcpy(local_1ac0,local_6b80,0x40);
        memcpy(local_1b00,local_6b40,0x40);
        auVar13 = vmovdqa64_avx512f(local_1b00);
        auVar15 = vmovdqa64_avx512f(local_1ac0);
        local_1a40 = vmovdqa64_avx512f(auVar13);
        local_1a80 = vmovdqa64_avx512f(auVar15);
        auVar13 = vmovdqa64_avx512f(local_1a40);
        auVar15 = vmovdqa64_avx512f(local_1a80);
        auVar15 = vpaddsw_avx512bw(auVar13,auVar15);
        local_5980 = vmovdqa64_avx512f(auVar15);
        pauVar11 = local_4d30;
      }
      set1_epi16<long_long__vector(8)>(auVar14._54_2_);
      auVar13 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(local_4f00);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      first_07[1] = in_stack_ffffffffffff8c40._0_8_;
      first_07[2] = in_stack_ffffffffffff8c40._8_8_;
      first_07[3] = in_stack_ffffffffffff8c40._16_8_;
      first_07[4] = in_stack_ffffffffffff8c40._24_8_;
      first_07[5] = in_stack_ffffffffffff8c40._32_8_;
      first_07[6] = in_stack_ffffffffffff8c40._40_8_;
      first_07[7] = in_stack_ffffffffffff8c40._48_8_;
      first_07[0] = in_stack_ffffffffffff8c38;
      second_07[1] = in_stack_ffffffffffff8c00._0_8_;
      second_07[2] = in_stack_ffffffffffff8c00._8_8_;
      second_07[3] = in_stack_ffffffffffff8c00._16_8_;
      second_07[4] = in_stack_ffffffffffff8c00._24_8_;
      second_07[5] = in_stack_ffffffffffff8c00._32_8_;
      second_07[6] = in_stack_ffffffffffff8c00._40_8_;
      second_07[7] = in_stack_ffffffffffff8c00._48_8_;
      second_07[0] = auVar15._56_8_;
      madd_epi16(first_07,second_07);
      local_4f00 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5080);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      first_08[1] = in_stack_ffffffffffff8c40._0_8_;
      first_08[2] = in_stack_ffffffffffff8c40._8_8_;
      first_08[3] = in_stack_ffffffffffff8c40._16_8_;
      first_08[4] = in_stack_ffffffffffff8c40._24_8_;
      first_08[5] = in_stack_ffffffffffff8c40._32_8_;
      first_08[6] = in_stack_ffffffffffff8c40._40_8_;
      first_08[7] = in_stack_ffffffffffff8c40._48_8_;
      first_08[0] = in_stack_ffffffffffff8c38;
      second_08[1] = in_stack_ffffffffffff8c00._0_8_;
      second_08[2] = in_stack_ffffffffffff8c00._8_8_;
      second_08[3] = in_stack_ffffffffffff8c00._16_8_;
      second_08[4] = in_stack_ffffffffffff8c00._24_8_;
      second_08[5] = in_stack_ffffffffffff8c00._32_8_;
      second_08[6] = in_stack_ffffffffffff8c00._40_8_;
      second_08[7] = in_stack_ffffffffffff8c00._48_8_;
      second_08[0] = auVar15._56_8_;
      madd_epi16(first_08,second_08);
      local_5080 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5200);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      first_09[1] = in_stack_ffffffffffff8c40._0_8_;
      first_09[2] = in_stack_ffffffffffff8c40._8_8_;
      first_09[3] = in_stack_ffffffffffff8c40._16_8_;
      first_09[4] = in_stack_ffffffffffff8c40._24_8_;
      first_09[5] = in_stack_ffffffffffff8c40._32_8_;
      first_09[6] = in_stack_ffffffffffff8c40._40_8_;
      first_09[7] = in_stack_ffffffffffff8c40._48_8_;
      first_09[0] = in_stack_ffffffffffff8c38;
      second_09[1] = in_stack_ffffffffffff8c00._0_8_;
      second_09[2] = in_stack_ffffffffffff8c00._8_8_;
      second_09[3] = in_stack_ffffffffffff8c00._16_8_;
      second_09[4] = in_stack_ffffffffffff8c00._24_8_;
      second_09[5] = in_stack_ffffffffffff8c00._32_8_;
      second_09[6] = in_stack_ffffffffffff8c00._40_8_;
      second_09[7] = in_stack_ffffffffffff8c00._48_8_;
      second_09[0] = auVar15._56_8_;
      madd_epi16(first_09,second_09);
      local_5200 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5380);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      first_10[1] = in_stack_ffffffffffff8c40._0_8_;
      first_10[2] = in_stack_ffffffffffff8c40._8_8_;
      first_10[3] = in_stack_ffffffffffff8c40._16_8_;
      first_10[4] = in_stack_ffffffffffff8c40._24_8_;
      first_10[5] = in_stack_ffffffffffff8c40._32_8_;
      first_10[6] = in_stack_ffffffffffff8c40._40_8_;
      first_10[7] = in_stack_ffffffffffff8c40._48_8_;
      first_10[0] = in_stack_ffffffffffff8c38;
      second_10[1] = in_stack_ffffffffffff8c00._0_8_;
      second_10[2] = in_stack_ffffffffffff8c00._8_8_;
      second_10[3] = in_stack_ffffffffffff8c00._16_8_;
      second_10[4] = in_stack_ffffffffffff8c00._24_8_;
      second_10[5] = in_stack_ffffffffffff8c00._32_8_;
      second_10[6] = in_stack_ffffffffffff8c00._40_8_;
      second_10[7] = in_stack_ffffffffffff8c00._48_8_;
      second_10[0] = auVar15._56_8_;
      madd_epi16(first_10,second_10);
      local_5380 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5500);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      first_11[1] = in_stack_ffffffffffff8c40._0_8_;
      first_11[2] = in_stack_ffffffffffff8c40._8_8_;
      first_11[3] = in_stack_ffffffffffff8c40._16_8_;
      first_11[4] = in_stack_ffffffffffff8c40._24_8_;
      first_11[5] = in_stack_ffffffffffff8c40._32_8_;
      first_11[6] = in_stack_ffffffffffff8c40._40_8_;
      first_11[7] = in_stack_ffffffffffff8c40._48_8_;
      first_11[0] = in_stack_ffffffffffff8c38;
      second_11[1] = in_stack_ffffffffffff8c00._0_8_;
      second_11[2] = in_stack_ffffffffffff8c00._8_8_;
      second_11[3] = in_stack_ffffffffffff8c00._16_8_;
      second_11[4] = in_stack_ffffffffffff8c00._24_8_;
      second_11[5] = in_stack_ffffffffffff8c00._32_8_;
      second_11[6] = in_stack_ffffffffffff8c00._40_8_;
      second_11[7] = in_stack_ffffffffffff8c00._48_8_;
      second_11[0] = auVar15._56_8_;
      madd_epi16(first_11,second_11);
      local_5500 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5680);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      first_12[1] = in_stack_ffffffffffff8c40._0_8_;
      first_12[2] = in_stack_ffffffffffff8c40._8_8_;
      first_12[3] = in_stack_ffffffffffff8c40._16_8_;
      first_12[4] = in_stack_ffffffffffff8c40._24_8_;
      first_12[5] = in_stack_ffffffffffff8c40._32_8_;
      first_12[6] = in_stack_ffffffffffff8c40._40_8_;
      first_12[7] = in_stack_ffffffffffff8c40._48_8_;
      first_12[0] = in_stack_ffffffffffff8c38;
      second_12[1] = in_stack_ffffffffffff8c00._0_8_;
      second_12[2] = in_stack_ffffffffffff8c00._8_8_;
      second_12[3] = in_stack_ffffffffffff8c00._16_8_;
      second_12[4] = in_stack_ffffffffffff8c00._24_8_;
      second_12[5] = in_stack_ffffffffffff8c00._32_8_;
      second_12[6] = in_stack_ffffffffffff8c00._40_8_;
      second_12[7] = in_stack_ffffffffffff8c00._48_8_;
      second_12[0] = auVar15._56_8_;
      madd_epi16(first_12,second_12);
      local_5680 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5800);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      first_13[1] = in_stack_ffffffffffff8c40._0_8_;
      first_13[2] = in_stack_ffffffffffff8c40._8_8_;
      first_13[3] = in_stack_ffffffffffff8c40._16_8_;
      first_13[4] = in_stack_ffffffffffff8c40._24_8_;
      first_13[5] = in_stack_ffffffffffff8c40._32_8_;
      first_13[6] = in_stack_ffffffffffff8c40._40_8_;
      first_13[7] = in_stack_ffffffffffff8c40._48_8_;
      first_13[0] = in_stack_ffffffffffff8c38;
      second_13[1] = in_stack_ffffffffffff8c00._0_8_;
      second_13[2] = in_stack_ffffffffffff8c00._8_8_;
      second_13[3] = in_stack_ffffffffffff8c00._16_8_;
      second_13[4] = in_stack_ffffffffffff8c00._24_8_;
      second_13[5] = in_stack_ffffffffffff8c00._32_8_;
      second_13[6] = in_stack_ffffffffffff8c00._40_8_;
      second_13[7] = in_stack_ffffffffffff8c00._48_8_;
      second_13[0] = auVar15._56_8_;
      madd_epi16(first_13,second_13);
      local_5800 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_5980);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(auVar13);
      vmovdqa64_avx512f(auVar13);
      first_14[1] = in_stack_ffffffffffff8c40._0_8_;
      first_14[2] = in_stack_ffffffffffff8c40._8_8_;
      first_14[3] = in_stack_ffffffffffff8c40._16_8_;
      first_14[4] = in_stack_ffffffffffff8c40._24_8_;
      first_14[5] = in_stack_ffffffffffff8c40._32_8_;
      first_14[6] = in_stack_ffffffffffff8c40._40_8_;
      first_14[7] = in_stack_ffffffffffff8c40._48_8_;
      first_14[0] = in_stack_ffffffffffff8c38;
      second_14[1] = in_stack_ffffffffffff8c00._0_8_;
      second_14[2] = in_stack_ffffffffffff8c00._8_8_;
      second_14[3] = in_stack_ffffffffffff8c00._16_8_;
      second_14[4] = in_stack_ffffffffffff8c00._24_8_;
      second_14[5] = in_stack_ffffffffffff8c00._32_8_;
      second_14[6] = in_stack_ffffffffffff8c00._40_8_;
      second_14[7] = in_stack_ffffffffffff8c00._48_8_;
      second_14[0] = auVar14._56_8_;
      madd_epi16(first_14,second_14);
      local_5980 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_4f00);
      auVar14 = vmovdqa64_avx512f(local_5080);
      auVar15 = vmovdqa64_avx512f(local_5200);
      auVar16 = vmovdqa64_avx512f(local_5380);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      vmovdqa64_avx512f(auVar16);
      auVar15 = vmovdqa64_avx512f(auVar15);
      vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(auVar13);
      vmovdqa64_avx512f(auVar13);
      sum0_00[1] = in_stack_ffffffffffff8ec0._0_8_;
      sum0_00[2] = in_stack_ffffffffffff8ec0._8_8_;
      sum0_00[3] = in_stack_ffffffffffff8ec0._16_8_;
      sum0_00[4] = in_stack_ffffffffffff8ec0._24_8_;
      sum0_00[5] = in_stack_ffffffffffff8ec0._32_8_;
      sum0_00[6] = in_stack_ffffffffffff8ec0._40_8_;
      sum0_00[7] = in_stack_ffffffffffff8ec0._48_8_;
      sum0_00[0] = in_stack_ffffffffffff8eb8;
      sum1_00[1] = in_stack_ffffffffffff8e80._0_8_;
      sum1_00[2] = in_stack_ffffffffffff8e80._8_8_;
      sum1_00[3] = in_stack_ffffffffffff8e80._16_8_;
      sum1_00[4] = in_stack_ffffffffffff8e80._24_8_;
      sum1_00[5] = in_stack_ffffffffffff8e80._32_8_;
      sum1_00[6] = in_stack_ffffffffffff8e80._40_8_;
      sum1_00[7] = in_stack_ffffffffffff8e80._48_8_;
      sum1_00[0] = in_stack_ffffffffffff8e78;
      sum2_00[1] = in_stack_ffffffffffff8e40._0_8_;
      sum2_00[2] = in_stack_ffffffffffff8e40._8_8_;
      sum2_00[3] = in_stack_ffffffffffff8e40._16_8_;
      sum2_00[4] = in_stack_ffffffffffff8e40._24_8_;
      sum2_00[5] = in_stack_ffffffffffff8e40._32_8_;
      sum2_00[6] = in_stack_ffffffffffff8e40._40_8_;
      sum2_00[7] = in_stack_ffffffffffff8e40._48_8_;
      sum2_00[0] = in_stack_ffffffffffff8e38;
      sum3_00[1] = in_stack_ffffffffffff8e00._0_8_;
      sum3_00[2] = in_stack_ffffffffffff8e00._8_8_;
      sum3_00[3] = in_stack_ffffffffffff8e00._16_8_;
      sum3_00[4] = in_stack_ffffffffffff8e00._24_8_;
      sum3_00[5] = in_stack_ffffffffffff8e00._32_8_;
      sum3_00[6] = in_stack_ffffffffffff8e00._40_8_;
      sum3_00[7] = in_stack_ffffffffffff8e00._48_8_;
      sum3_00[0] = in_stack_ffffffffffff8df8;
      Pack0123(sum0_00,sum1_00,sum2_00,sum3_00);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(local_5500);
      auVar15 = vmovdqa64_avx512f(local_5680);
      auVar16 = vmovdqa64_avx512f(local_5800);
      auVar17 = vmovdqa64_avx512f(local_5980);
      auVar14 = vmovdqa64_avx512f(auVar14);
      in_stack_ffffffffffff8e80 = auVar14._0_56_;
      in_stack_ffffffffffff8eb8 = auVar14._56_8_;
      auVar15 = vmovdqa64_avx512f(auVar15);
      in_stack_ffffffffffff8e40 = auVar15._0_56_;
      in_stack_ffffffffffff8e78 = auVar15._56_8_;
      auVar16 = vmovdqa64_avx512f(auVar16);
      in_stack_ffffffffffff8e00 = auVar16._0_56_;
      in_stack_ffffffffffff8e38 = auVar16._56_8_;
      auVar17 = vmovdqa64_avx512f(auVar17);
      in_stack_ffffffffffff8df8 = auVar17._56_8_;
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      in_stack_ffffffffffff8c40 = auVar17._0_56_;
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      in_stack_ffffffffffff8c00 = auVar16._0_56_;
      in_stack_ffffffffffff8c38 = auVar16._56_8_;
      auVar15 = vmovdqa64_avx512f(auVar15);
      vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar14);
      sum0_01[1] = in_stack_ffffffffffff8ec0._0_8_;
      sum0_01[2] = in_stack_ffffffffffff8ec0._8_8_;
      sum0_01[3] = in_stack_ffffffffffff8ec0._16_8_;
      sum0_01[4] = in_stack_ffffffffffff8ec0._24_8_;
      sum0_01[5] = in_stack_ffffffffffff8ec0._32_8_;
      sum0_01[6] = in_stack_ffffffffffff8ec0._40_8_;
      sum0_01[7] = in_stack_ffffffffffff8ec0._48_8_;
      sum0_01[0] = in_stack_ffffffffffff8eb8;
      sum1_01[1] = in_stack_ffffffffffff8e80._0_8_;
      sum1_01[2] = in_stack_ffffffffffff8e80._8_8_;
      sum1_01[3] = in_stack_ffffffffffff8e80._16_8_;
      sum1_01[4] = in_stack_ffffffffffff8e80._24_8_;
      sum1_01[5] = in_stack_ffffffffffff8e80._32_8_;
      sum1_01[6] = in_stack_ffffffffffff8e80._40_8_;
      sum1_01[7] = in_stack_ffffffffffff8e80._48_8_;
      sum1_01[0] = in_stack_ffffffffffff8e78;
      sum2_01[1] = in_stack_ffffffffffff8e40._0_8_;
      sum2_01[2] = in_stack_ffffffffffff8e40._8_8_;
      sum2_01[3] = in_stack_ffffffffffff8e40._16_8_;
      sum2_01[4] = in_stack_ffffffffffff8e40._24_8_;
      sum2_01[5] = in_stack_ffffffffffff8e40._32_8_;
      sum2_01[6] = in_stack_ffffffffffff8e40._40_8_;
      sum2_01[7] = in_stack_ffffffffffff8e40._48_8_;
      sum2_01[0] = in_stack_ffffffffffff8e38;
      sum3_01[1] = in_stack_ffffffffffff8e00._0_8_;
      sum3_01[2] = in_stack_ffffffffffff8e00._8_8_;
      sum3_01[3] = in_stack_ffffffffffff8e00._16_8_;
      sum3_01[4] = in_stack_ffffffffffff8e00._24_8_;
      sum3_01[5] = in_stack_ffffffffffff8e00._32_8_;
      sum3_01[6] = in_stack_ffffffffffff8e00._40_8_;
      sum3_01[7] = in_stack_ffffffffffff8e00._48_8_;
      sum3_01[0] = in_stack_ffffffffffff8df8;
      Pack0123(sum0_01,sum1_01,sum2_01,sum3_01);
      auVar14 = vmovdqa64_avx512f(auVar14);
      in_stack_ffffffffffff8ec0 = auVar14._0_56_;
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar33 = auVar13._0_56_;
      auVar14 = vmovdqa64_avx512f(auVar14);
      local_7300 = auVar14._0_56_;
      auVar15 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar13);
      auVar12 = auVar15._0_24_;
      vmovdqa64_avx512f(auVar15);
      pack0123_00[1] = in_stack_ffffffffffff8d80._0_8_;
      pack0123_00[2] = in_stack_ffffffffffff8d80._8_8_;
      pack0123_00[3] = in_stack_ffffffffffff8d80._16_8_;
      pack0123_00[4] = in_stack_ffffffffffff8d80._24_8_;
      pack0123_00[0] = auVar13._56_8_;
      pack0123_00[5] = (longlong)in_stack_ffffffffffff8da0;
      pack0123_00[6] = in_stack_ffffffffffff8da8;
      pack0123_00[7] = in_stack_ffffffffffff8db0;
      pack4567_00[1] = auVar33._0_8_;
      pack4567_00[2] = auVar33._8_8_;
      pack4567_00[3] = auVar33._16_8_;
      pack4567_00[4] = auVar33._24_8_;
      pack4567_00[5] = auVar33._32_8_;
      pack4567_00[6] = auVar33._40_8_;
      pack4567_00[7] = auVar33._48_8_;
      pack4567_00[0] = auVar14._56_8_;
      PermuteSummer(pack0123_00,pack4567_00);
      this = auVar12._0_8_;
      uVar31 = auVar12._8_8_;
      lVar32 = auVar12._16_8_;
      in_stack_ffffffffffff8da0 = this;
      in_stack_ffffffffffff8da8 = uVar31;
      in_stack_ffffffffffff8db0 = lVar32;
      callbacks::OutputBufferInfo::OutputBufferInfo
                (&local_7310,local_4d14,local_4d04,local_4c24,local_4c2c);
      input[1] = (longlong)this;
      input[0] = in_stack_ffffffffffff8c98;
      input[2] = uVar31;
      input[3] = lVar32;
      callbacks::CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndWrite>::Run
                (this,input,in_stack_ffffffffffff8c90);
    }
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void Multiply(const int8_t *A, const int8_t *B, Index A_rows, Index width, Index B_cols, Callback callback) {
    // This is copy-paste from Multiply8_SSE2OrAVX2.
    assert(width % sizeof(Register) == 0);
    assert(B_cols % 8 == 0);
    assert(reinterpret_cast<uintptr_t>(A) % sizeof(Register) == 0);
    assert(reinterpret_cast<uintptr_t>(B) % sizeof(Register) == 0);
    // There's 8 results for INTGEMM_AVX2 to handle.
    auto callback_impl = callbacks::CallbackImpl<CPUType::AVX2, Callback>(callback);
    const Index simd_width = width / sizeof(Register);
    // Added for AVX512.
    Register zeros = setzero_si<Register>();
    // Go over 8 columns of B at a time.
#pragma omp for
    for (Index B0_colidx = 0; B0_colidx < B_cols; B0_colidx += 8) {
      const Register *B0_col = reinterpret_cast<const Register*>(B) + B0_colidx * simd_width;
      // Process one row of A at a time.  Doesn't seem to be faster to do multiple rows of A at once.
      for (Index A_rowidx = 0; A_rowidx < A_rows; ++A_rowidx) {
        // Iterate over shared (inner) dimension.
        const Register *A_live = reinterpret_cast<const Register *>(A + A_rowidx * width);
        const Register *A_end = A_live + simd_width;
        const Register *B_live = B0_col;

        // Do the first iteration to initialize the sums.
        __m512i a = *A_live;
        __mmask64 neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
        __m512i a_positive = _mm512_abs_epi8(a);
        // These will be packed 16-bit integers containing sums for each column of B multiplied by the row of A.
        Register sum0 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[0], neg_mask, zeros, B_live[0]));
        Register sum1 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[1], neg_mask, zeros, B_live[1]));
        Register sum2 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[2], neg_mask, zeros, B_live[2]));
        Register sum3 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[3], neg_mask, zeros, B_live[3]));
        Register sum4 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[4], neg_mask, zeros, B_live[4]));
        Register sum5 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[5], neg_mask, zeros, B_live[5]));
        Register sum6 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[6], neg_mask, zeros, B_live[6]));
        Register sum7 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[7], neg_mask, zeros, B_live[7]));

        ++A_live;
        B_live += 8;

        // Use A as the loop variable so the add can be done where gcc likes it
        // for branch prediction.
        for (; A_live != A_end; ++A_live, B_live += 8) {
          // Unique code here: can we do an inline function?
          // Retrieve a.  We will use this as the unsigned part.
          a = *A_live;
          // Retrieve the conveniently consecutive values of B.
          __m512i b0 = *B_live;
          __m512i b1 = *(B_live + 1);
          __m512i b2 = *(B_live + 2);
          __m512i b3 = *(B_live + 3);
          __m512i b4 = *(B_live + 4);
          __m512i b5 = *(B_live + 5);
          __m512i b6 = *(B_live + 6);
          __m512i b7 = *(B_live + 7);

          // Get a mask where a is negative.
          // Didn't seem to make a difference definining sign bits here vs at top
          neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
          a_positive = _mm512_abs_epi8(a);

          // Negate by subtracting from zero with a mask.
          b0 = _mm512_mask_sub_epi8(b0, neg_mask, zeros, b0);
          b1 = _mm512_mask_sub_epi8(b1, neg_mask, zeros, b1);
          b2 = _mm512_mask_sub_epi8(b2, neg_mask, zeros, b2);
          b3 = _mm512_mask_sub_epi8(b3, neg_mask, zeros, b3);
          b4 = _mm512_mask_sub_epi8(b4, neg_mask, zeros, b4);
          b5 = _mm512_mask_sub_epi8(b5, neg_mask, zeros, b5);
          b6 = _mm512_mask_sub_epi8(b6, neg_mask, zeros, b6);
          b7 = _mm512_mask_sub_epi8(b7, neg_mask, zeros, b7);
          // The magic 8-bit multiply then horizontal sum into 16-bit.
          b0 = _mm512_maddubs_epi16(a_positive, b0);
          b1 = _mm512_maddubs_epi16(a_positive, b1);
          b2 = _mm512_maddubs_epi16(a_positive, b2);
          b3 = _mm512_maddubs_epi16(a_positive, b3);
          b4 = _mm512_maddubs_epi16(a_positive, b4);
          b5 = _mm512_maddubs_epi16(a_positive, b5);
          b6 = _mm512_maddubs_epi16(a_positive, b6);
          b7 = _mm512_maddubs_epi16(a_positive, b7);
          // Now we have 16-bit results that are the sum of two multiplies.
          // Choosing to approximate and do adds.
          // Perhaps every so often we could accumulate by upcasting.
          sum0 = _mm512_adds_epi16(sum0, b0);
          sum1 = _mm512_adds_epi16(sum1, b1);
          sum2 = _mm512_adds_epi16(sum2, b2);
          sum3 = _mm512_adds_epi16(sum3, b3);
          sum4 = _mm512_adds_epi16(sum4, b4);
          sum5 = _mm512_adds_epi16(sum5, b5);
          sum6 = _mm512_adds_epi16(sum6, b6);
          sum7 = _mm512_adds_epi16(sum7, b7);
          // Unique code ends: can we do an inline function?
        }
        // Upcast to 32-bit and horizontally add.
        Register ones = set1_epi16<Register>(1);
        sum0 = madd_epi16(sum0, ones);
        sum1 = madd_epi16(sum1, ones);
        sum2 = madd_epi16(sum2, ones);
        sum3 = madd_epi16(sum3, ones);
        sum4 = madd_epi16(sum4, ones);
        sum5 = madd_epi16(sum5, ones);
        sum6 = madd_epi16(sum6, ones);
        sum7 = madd_epi16(sum7, ones);
        Register pack0123 = Pack0123(sum0, sum1, sum2, sum3);
        Register pack4567 = Pack0123(sum4, sum5, sum6, sum7);

        auto total = PermuteSummer(pack0123, pack4567);
        callback_impl.Run(total, callbacks::OutputBufferInfo(A_rowidx, B0_colidx, A_rows, B_cols));
      }
    }
  }